

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_secret_arg.cpp
# Opt level: O1

void __thiscall PatchSecretARG::alter_world(PatchSecretARG *this,World *w)

{
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *this_00;
  pointer *ppMVar1;
  uint16_t uVar2;
  Map *pMVar3;
  pointer ppCVar4;
  ColorPalette<13UL> *pCVar5;
  MapPalette *pMVar6;
  iterator iVar7;
  pointer ppEVar8;
  mapped_type pMVar9;
  size_type sVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 *puVar16;
  undefined3 uVar17;
  undefined7 uVar18;
  Color CVar19;
  Color CVar20;
  Color CVar21;
  Color CVar22;
  Color CVar23;
  Color CVar24;
  Color CVar25;
  Color CVar26;
  Color CVar27;
  Color CVar28;
  Color CVar29;
  uint5 uVar30;
  undefined4 uVar31;
  uint8_t uVar32;
  uint8_t uVar33;
  uint8_t uVar34;
  uint8_t uVar35;
  undefined2 uVar36;
  uint8_t uVar37;
  undefined1 uVar38;
  bool bVar39;
  bool bVar40;
  mapped_type *ppMVar41;
  Entity *pEVar42;
  pointer pcVar43;
  MapPalette *palette;
  MapPalette *palette_00;
  MapConnection *pMVar44;
  Entity *pEVar45;
  pointer ppEVar46;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar47;
  long lVar48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar49;
  long lVar50;
  ulong uVar51;
  byte bVar52;
  undefined1 *puVar53;
  long *plVar54;
  byte bVar55;
  bool bVar56;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string PREFIX_STRING;
  size_type __dnew_4;
  size_type __dnew;
  size_type __dnew_9;
  size_type __dnew_6;
  size_type __dnew_2;
  size_type __dnew_5;
  size_type __dnew_10;
  undefined1 local_398 [32];
  pointer pEStack_378;
  pointer local_370;
  pointer pEStack_368;
  undefined **local_360;
  uint16_t local_358;
  uint8_t local_356;
  undefined2 local_350;
  bool local_34e;
  mapped_type local_348;
  bool local_339;
  PatchSecretARG *local_338;
  undefined1 local_330 [32];
  pointer pEStack_310;
  pointer pEStack_308;
  pointer pEStack_300;
  undefined **local_2f8;
  uint16_t local_2f0;
  uint8_t local_2ee;
  undefined2 local_2e8;
  bool local_2e6;
  undefined1 local_2e0 [32];
  pointer pEStack_2c0;
  pointer pEStack_2b8;
  pointer pEStack_2b0;
  undefined **local_2a8;
  uint16_t local_2a0;
  uint8_t local_29e;
  undefined2 local_298;
  bool local_296;
  undefined1 local_290 [32];
  pointer pEStack_270;
  pointer local_268;
  undefined1 auStack_260 [16];
  undefined4 *local_250;
  ulong local_248;
  undefined4 local_240;
  undefined1 local_23c;
  undefined4 *local_230;
  undefined8 local_228;
  undefined4 local_220;
  undefined3 uStack_21c;
  undefined1 local_219;
  undefined4 *local_210;
  undefined8 local_208;
  undefined4 local_200;
  undefined2 local_1fc;
  undefined1 local_1fa;
  undefined4 *local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined2 local_1dc;
  undefined1 local_1da;
  undefined4 *local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined2 uStack_1bc;
  undefined1 uStack_1ba;
  long *local_1b0 [2];
  undefined8 local_1a0;
  vector<MapConnection,_std::allocator<MapConnection>_> *local_190;
  Attributes local_188;
  MapPalette *local_130;
  size_type local_128;
  undefined1 local_120 [32];
  pointer pEStack_100;
  pointer pEStack_f8;
  pointer pEStack_f0;
  undefined **local_e8;
  uint16_t local_e0;
  uint8_t local_de;
  undefined2 local_d8;
  bool local_d6;
  Attributes local_d0;
  undefined1 local_80 [32];
  pointer pEStack_60;
  pointer local_58;
  pointer pEStack_50;
  undefined **local_48;
  uint16_t local_40;
  uint8_t local_3e;
  undefined2 local_38;
  bool local_36;
  
  local_290._0_2_ = 0x72;
  this_00 = &w->_maps;
  local_338 = this;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3 = *ppMVar41;
  pEVar42 = (Entity *)operator_new(0x58);
  local_290._0_2_ = 0x109c;
  local_290[2] = '*';
  local_290[3] = false;
  local_290[4] = false;
  local_290[5] = false;
  local_290[6] = false;
  local_290[7] = '\x02';
  local_290[8] = '\x01';
  local_290._18_2_ = 0;
  local_290[9] = '\0';
  local_290[10] = false;
  local_290[0xb] = false;
  local_290[0xc] = false;
  local_290[0xd] = false;
  local_290[0xe] = false;
  local_290[0xf] = false;
  local_290[0x10] = '\0';
  local_290._24_8_ = (Entity *)0x0;
  pEStack_270 = (pointer)0x0;
  local_268 = (pointer)0x0;
  auStack_260._0_8_ = (pointer)0x0;
  auStack_260._8_8_ = &PTR_to_json_abi_cxx11__00261860;
  local_250 = (undefined4 *)CONCAT53(local_250._3_5_,0xff00ff);
  local_248 = local_248 & 0xffffffffff000000;
  Entity::Entity(pEVar42,(Attributes *)local_290);
  if (pEStack_270 != (pointer)0x0) {
    operator_delete(pEStack_270,auStack_260._0_8_ - (long)pEStack_270);
  }
  Map::add_entity(pMVar3,pEVar42);
  puVar53 = local_398 + 0x10;
  local_398[0] = (uint8_t)puVar53;
  local_398[1] = (byte)((ulong)puVar53 >> 8);
  local_398[2] = (byte)((ulong)puVar53 >> 0x10);
  local_398[3] = (uint8_t)((ulong)puVar53 >> 0x18);
  local_398._4_2_ = (undefined2)((ulong)puVar53 >> 0x20);
  local_398[6] = SUB81((ulong)puVar53 >> 0x30,0);
  local_398[7] = (uint8_t)((ulong)puVar53 >> 0x38);
  local_2e0[0] = true;
  local_2e0[1] = '\0';
  local_2e0[2] = '\0';
  local_2e0[3] = '\0';
  local_2e0[4] = false;
  local_2e0[5] = false;
  local_2e0[6] = false;
  local_2e0[7] = '\0';
  pcVar43 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398
                      ,(size_type *)local_2e0,0);
  uVar31 = local_2e0._3_4_;
  local_398[0] = (uint8_t)pcVar43;
  local_398[1] = (byte)((ulong)pcVar43 >> 8);
  local_398[2] = (byte)((ulong)pcVar43 >> 0x10);
  local_398[3] = (uint8_t)((ulong)pcVar43 >> 0x18);
  local_398._4_2_ = (undefined2)((ulong)pcVar43 >> 0x20);
  local_398[6] = SUB81((ulong)pcVar43 >> 0x30,0);
  local_398[7] = (uint8_t)((ulong)pcVar43 >> 0x38);
  uVar17 = CONCAT12(local_2e0[2],CONCAT11(local_2e0[1],local_2e0[0]));
  uVar18 = CONCAT43(local_2e0._3_4_,uVar17);
  lVar48 = CONCAT17(local_2e0[7],uVar18);
  local_398[0x10] = local_2e0[0];
  uVar38 = local_398[0x10];
  local_398[0x11] = local_2e0[1];
  local_398._18_2_ = (undefined2)((uint7)uVar18 >> 0x10);
  local_398._20_4_ = (undefined4)((ulong)lVar48 >> 0x20);
  memcpy(pcVar43,
         "Foxy: What you are about to\naccomplish is grand, but can\nyou feel there is more to it?\x1e\nThis island hides a bigger\nmystery, something that has\nyet to be solved...\x1e\nPerhaps you should take a\ncloser look at the\ncrypt of Mercator.\x03"
         ,0xe4);
  local_398._9_2_ = (undefined2)((uint3)uVar17 >> 8);
  local_398[0xb] = SUB41(uVar31,0);
  local_398[0xc] = SUB41(uVar31,1);
  local_398[0xd] = SUB41(uVar31,2);
  local_398._14_2_ = (undefined2)((ulong)lVar48 >> 0x30);
  pcVar43[lVar48] = '\0';
  local_398[8] = uVar38;
  RandomizerWorld::add_custom_dialogue_raw((RandomizerWorld *)w,pEVar42,(string *)local_398);
  puVar16 = (undefined1 *)
            CONCAT17(local_398[7],
                     CONCAT16(local_398[6],
                              CONCAT24(local_398._4_2_,
                                       CONCAT13(local_398[3],
                                                CONCAT12(local_398[2],
                                                         CONCAT11(local_398[1],local_398[0]))))));
  if (puVar16 != puVar53) {
    operator_delete(puVar16,CONCAT44(local_398._20_4_,
                                     CONCAT22(local_398._18_2_,
                                              CONCAT11(local_398[0x11],local_398[0x10]))) + 1);
  }
  palette = (MapPalette *)operator_new(0x34);
  ppCVar4 = (w->_map_palettes).
            super__Vector_base<ColorPalette<13UL>_*,_std::allocator<ColorPalette<13UL>_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)((long)(w->_map_palettes).
                    super__Vector_base<ColorPalette<13UL>_*,_std::allocator<ColorPalette<13UL>_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3) < 0x20) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0x1f);
  }
  pCVar5 = ppCVar4[0x1f];
  (palette->super_array<Color,_13UL>)._M_elems[0xc] =
       (pCVar5->super_array<Color,_13UL>)._M_elems[0xc];
  uVar11 = *(undefined8 *)(pCVar5->super_array<Color,_13UL>)._M_elems;
  uVar12 = *(undefined8 *)((pCVar5->super_array<Color,_13UL>)._M_elems + 2);
  uVar13 = *(undefined8 *)((pCVar5->super_array<Color,_13UL>)._M_elems + 4);
  uVar14 = *(undefined8 *)((pCVar5->super_array<Color,_13UL>)._M_elems + 6);
  uVar15 = *(undefined8 *)((pCVar5->super_array<Color,_13UL>)._M_elems + 10);
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 8) =
       *(undefined8 *)((pCVar5->super_array<Color,_13UL>)._M_elems + 8);
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 10) = uVar15;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 4) = uVar13;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 6) = uVar14;
  *(undefined8 *)(palette->super_array<Color,_13UL>)._M_elems = uVar11;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 2) = uVar12;
  Color::Color((Color *)local_290,' ',' ',0xc0);
  CVar19._b = local_290[2];
  CVar19._r = local_290[0];
  CVar19._g = local_290[1];
  CVar19._invalid = (bool)local_290[3];
  (palette->super_array<Color,_13UL>)._M_elems[0] = CVar19;
  Color::Color((Color *)local_290,'`','`',0xc0);
  CVar20._b = local_290[2];
  CVar20._r = local_290[0];
  CVar20._g = local_290[1];
  CVar20._invalid = (bool)local_290[3];
  (palette->super_array<Color,_13UL>)._M_elems[1] = CVar20;
  Color::Color((Color *)local_290,0xa0,0xa0,0xc0);
  CVar21._b = local_290[2];
  CVar21._r = local_290[0];
  CVar21._g = local_290[1];
  CVar21._invalid = (bool)local_290[3];
  (palette->super_array<Color,_13UL>)._M_elems[2] = CVar21;
  Color::Color((Color *)local_290,'@','\0','@');
  CVar22._b = local_290[2];
  CVar22._r = local_290[0];
  CVar22._g = local_290[1];
  CVar22._invalid = (bool)local_290[3];
  (palette->super_array<Color,_13UL>)._M_elems[4] = CVar22;
  Color::Color((Color *)local_290,0x80,0x80,'\0');
  CVar23._b = local_290[2];
  CVar23._r = local_290[0];
  CVar23._g = local_290[1];
  CVar23._invalid = (bool)local_290[3];
  (palette->super_array<Color,_13UL>)._M_elems[0xb] = CVar23;
  Color::Color((Color *)local_290,0xc0,0xe0,'\0');
  CVar24._b = local_290[2];
  CVar24._r = local_290[0];
  CVar24._g = local_290[1];
  CVar24._invalid = (bool)local_290[3];
  (palette->super_array<Color,_13UL>)._M_elems[0xc] = CVar24;
  World::add_map_palette(w,palette);
  palette_00 = (MapPalette *)operator_new(0x34);
  local_290._0_2_ = 0x131;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar6 = (*ppMVar41)->_palette;
  (palette_00->super_array<Color,_13UL>)._M_elems[0xc] =
       (pMVar6->super_array<Color,_13UL>)._M_elems[0xc];
  uVar11 = *(undefined8 *)(pMVar6->super_array<Color,_13UL>)._M_elems;
  uVar12 = *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 2);
  uVar13 = *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 4);
  uVar14 = *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 6);
  uVar15 = *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 10);
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 8) =
       *(undefined8 *)((pMVar6->super_array<Color,_13UL>)._M_elems + 8);
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 10) = uVar15;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 4) = uVar13;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 6) = uVar14;
  *(undefined8 *)(palette_00->super_array<Color,_13UL>)._M_elems = uVar11;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 2) = uVar12;
  Color::Color((Color *)local_290,' ',' ','`');
  CVar25._b = local_290[2];
  CVar25._r = local_290[0];
  CVar25._g = local_290[1];
  CVar25._invalid = (bool)local_290[3];
  (palette_00->super_array<Color,_13UL>)._M_elems[1] = CVar25;
  Color::Color((Color *)local_290,' ','@',0x80);
  CVar26._b = local_290[2];
  CVar26._r = local_290[0];
  CVar26._g = local_290[1];
  CVar26._invalid = (bool)local_290[3];
  (palette_00->super_array<Color,_13UL>)._M_elems[2] = CVar26;
  Color::Color((Color *)local_290,'@','`',0xa0);
  CVar27._b = local_290[2];
  CVar27._r = local_290[0];
  CVar27._g = local_290[1];
  CVar27._invalid = (bool)local_290[3];
  (palette_00->super_array<Color,_13UL>)._M_elems[3] = CVar27;
  Color::Color((Color *)local_290,' ',' ','@');
  CVar28._b = local_290[2];
  CVar28._r = local_290[0];
  CVar28._g = local_290[1];
  CVar28._invalid = (bool)local_290[3];
  (palette_00->super_array<Color,_13UL>)._M_elems[5] = CVar28;
  Color::Color((Color *)local_290,' ','`',0x80);
  CVar29._b = local_290[2];
  CVar29._r = local_290[0];
  CVar29._g = local_290[1];
  CVar29._invalid = (bool)local_290[3];
  (palette_00->super_array<Color,_13UL>)._M_elems[8] = CVar29;
  World::add_map_palette(w,palette_00);
  local_290._0_2_ = 0x290;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3 = *ppMVar41;
  Map::clear_entities(pMVar3);
  local_290._0_2_ = 0x7c;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3->_layout = (*ppMVar41)->_layout;
  local_290._0_2_ = 0x7c;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3->_blockset = (*ppMVar41)->_blockset;
  pMVar3->_palette = palette;
  pMVar3->_background_music = '\n';
  local_348 = (mapped_type)palette;
  pMVar44 = World::map_connection(w,0x287,pMVar3->_id);
  if (pMVar44->_map_id_1 == pMVar3->_id) {
    lVar48 = 3;
    lVar50 = 2;
  }
  else {
    if (pMVar44->_map_id_2 != pMVar3->_id) goto LAB_0014c69f;
    lVar48 = 9;
    lVar50 = 8;
  }
  *(undefined1 *)((long)&pMVar44->_map_id_1 + lVar50) = 0x1b;
  *(undefined1 *)((long)&pMVar44->_map_id_1 + lVar48) = 0x17;
LAB_0014c69f:
  puVar53 = local_398 + 0x10;
  pEVar42 = (Entity *)operator_new(0x58);
  local_290._0_2_ = 0x13a5;
  local_290[2] = '\x19';
  local_290[3] = '\x02';
  local_290[4] = true;
  local_290[5] = true;
  local_290[6] = false;
  local_290[7] = '\x01';
  local_290[8] = '\x01';
  local_290._18_2_ = 0;
  local_290[9] = '\0';
  local_290[10] = false;
  local_290[0xb] = false;
  local_290[0xc] = false;
  local_290[0xd] = false;
  local_290[0xe] = false;
  local_290[0xf] = false;
  local_290[0x10] = '\0';
  local_290._24_8_ = (Entity *)0x0;
  pEStack_270 = (pointer)0x0;
  local_268 = (pointer)0x0;
  auStack_260._0_8_ = (pointer)0x0;
  auStack_260._8_8_ = &PTR_to_json_abi_cxx11__00261860;
  local_250 = (undefined4 *)CONCAT53(local_250._3_5_,0xff00ff);
  local_248 = local_248 & 0xffffffffff000000;
  Entity::Entity(pEVar42,(Attributes *)local_290);
  local_130 = palette_00;
  if (pEStack_270 != (pointer)0x0) {
    operator_delete(pEStack_270,auStack_260._0_8_ - (long)pEStack_270);
  }
  (pEVar42->_attrs).fightable = false;
  (pEVar42->_attrs).behavior_id = 0;
  local_2e0[0] = false;
  local_398[0] = ',';
  local_398[1] = '\0';
  local_398[2] = '\0';
  local_398[3] = '\0';
  std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
  emplace_back<bool,int,unsigned_char_const&>
            ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)&(pEVar42->_attrs).mask_flags,
             (bool *)local_2e0,(int *)local_398,&FLAG_ALL_VALID_EQUIPMENTS.bit);
  Map::add_entity(pMVar3,pEVar42);
  local_398[0] = (uint8_t)puVar53;
  local_398[1] = (byte)((ulong)puVar53 >> 8);
  local_398[2] = (byte)((ulong)puVar53 >> 0x10);
  local_398[3] = (uint8_t)((ulong)puVar53 >> 0x18);
  local_398._4_2_ = (undefined2)((ulong)puVar53 >> 0x20);
  local_398[6] = SUB81((ulong)puVar53 >> 0x30,0);
  local_398[7] = (uint8_t)((ulong)puVar53 >> 0x38);
  local_2e0[0] = true;
  local_2e0[1] = '\0';
  local_2e0[2] = '\0';
  local_2e0[3] = '\0';
  local_2e0[4] = false;
  local_2e0[5] = false;
  local_2e0[6] = false;
  local_2e0[7] = '\0';
  pcVar43 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398
                      ,(size_type *)local_2e0,0);
  uVar31 = local_2e0._3_4_;
  local_398[0] = (uint8_t)pcVar43;
  local_398[1] = (byte)((ulong)pcVar43 >> 8);
  local_398[2] = (byte)((ulong)pcVar43 >> 0x10);
  local_398[3] = (uint8_t)((ulong)pcVar43 >> 0x18);
  local_398._4_2_ = (undefined2)((ulong)pcVar43 >> 0x20);
  local_398[6] = SUB81((ulong)pcVar43 >> 0x30,0);
  local_398[7] = (uint8_t)((ulong)pcVar43 >> 0x38);
  uVar17 = CONCAT12(local_2e0[2],CONCAT11(local_2e0[1],local_2e0[0]));
  uVar18 = CONCAT43(local_2e0._3_4_,uVar17);
  lVar48 = CONCAT17(local_2e0[7],uVar18);
  local_398[0x10] = local_2e0[0];
  uVar38 = local_398[0x10];
  local_398[0x11] = local_2e0[1];
  local_398._18_2_ = (undefined2)((uint7)uVar18 >> 0x10);
  local_398._20_4_ = (undefined4)((ulong)lVar48 >> 0x20);
  memcpy(pcVar43,
         "Nole: A LONG TIME AGO, A DRAGON\nNAMED GOLA CAST A SPELL ON ME.\x1e\nI KNOW YOU DEFEATED ME IN\nMANY OTHER WORLDS, AS MY CURSE\nIS TO SEE AND REMEMBER THEM ALL.\x1e\nONLY YOU CAN END THIS, BUT\nTO GO ANY FURTHER, YOU WILL NEED\nTHE RIGHT TOOLS FOR THE JOB.\x03"
         ,0xf4);
  local_398._9_2_ = (undefined2)((uint3)uVar17 >> 8);
  local_398[0xb] = SUB41(uVar31,0);
  local_398[0xc] = SUB41(uVar31,1);
  local_398[0xd] = SUB41(uVar31,2);
  local_398._14_2_ = (undefined2)((ulong)lVar48 >> 0x30);
  pcVar43[lVar48] = '\0';
  local_398[8] = uVar38;
  RandomizerWorld::add_custom_dialogue_raw((RandomizerWorld *)w,pEVar42,(string *)local_398);
  puVar16 = (undefined1 *)
            CONCAT17(local_398[7],
                     CONCAT16(local_398[6],
                              CONCAT24(local_398._4_2_,
                                       CONCAT13(local_398[3],
                                                CONCAT12(local_398[2],
                                                         CONCAT11(local_398[1],local_398[0]))))));
  if (puVar16 != puVar53) {
    operator_delete(puVar16,CONCAT44(local_398._20_4_,
                                     CONCAT22(local_398._18_2_,
                                              CONCAT11(local_398[0x11],local_398[0x10]))) + 1);
  }
  pEVar42 = (Entity *)operator_new(0x58);
  local_398[0] = '\x13';
  local_398[1] = '\x0f';
  local_398[2] = '\x15';
  local_398[3] = '\a';
  local_398[4] = true;
  local_398[5] = false;
  local_398[6] = false;
  local_398[7] = '\0';
  local_398[8] = '\x02';
  local_398._18_2_ = 0;
  local_398[9] = '\0';
  local_398[10] = false;
  local_398[0xb] = false;
  local_398[0xc] = false;
  local_398[0xd] = false;
  local_398[0xe] = false;
  local_398[0xf] = false;
  local_398[0x10] = '\0';
  local_398._24_8_ = 0;
  pEStack_378 = (pointer)0x0;
  local_370 = (pointer)0x0;
  pEStack_368 = (pointer)0x0;
  local_360 = &PTR_to_json_abi_cxx11__00261860;
  local_358 = 0xff;
  local_356 = 0xff;
  local_350._0_1_ = false;
  local_350._1_1_ = false;
  local_34e = false;
  Entity::Entity(pEVar42,(Attributes *)local_398);
  if (pEStack_378 != (pointer)0x0) {
    operator_delete(pEStack_378,(long)pEStack_368 - (long)pEStack_378);
  }
  Map::add_entity(pMVar3,pEVar42);
  pEVar45 = (Entity *)operator_new(0x58);
  local_2e0[0] = true;
  local_2e0[1] = '\x10';
  local_2e0[2] = '\x15';
  local_2e0[3] = '\a';
  local_2e0[4] = true;
  local_2e0[5] = false;
  local_2e0[6] = false;
  local_2e0[7] = '\0';
  local_2e0._18_2_ = 0;
  local_2e0[8] = '\x01';
  local_2e0[9] = '\0';
  local_2e0[10] = false;
  local_2e0[0xb] = false;
  local_2e0[0xc] = false;
  local_2e0[0xd] = false;
  local_2e0[0xe] = false;
  local_2e0[0xf] = false;
  local_2e0[0x10] = '\0';
  pEStack_2c0 = (pointer)0x0;
  pEStack_2b8 = (pointer)0x0;
  pEStack_2b0 = (pointer)0x0;
  local_2a8 = &PTR_to_json_abi_cxx11__00261860;
  local_2a0 = 0xff;
  local_29e = 0xff;
  local_298._0_1_ = false;
  local_298._1_1_ = false;
  local_296 = false;
  local_2e0._24_8_ = pEVar42;
  Entity::Entity(pEVar45,(Attributes *)local_2e0);
  Map::add_entity(pMVar3,pEVar45);
  if (pEStack_2c0 != (pointer)0x0) {
    operator_delete(pEStack_2c0,(long)pEStack_2b0 - (long)pEStack_2c0);
  }
  pEVar45 = (Entity *)operator_new(0x58);
  local_330._0_8_ = (pointer)0x7151313;
  local_330[8] = '\x02';
  local_330._18_2_ = 0;
  local_330[9] = '\0';
  local_330[10] = false;
  local_330[0xb] = false;
  local_330[0xc] = false;
  local_330[0xd] = false;
  local_330[0xe] = false;
  local_330[0xf] = false;
  local_330[0x10] = '\0';
  pEStack_310 = (pointer)0x0;
  pEStack_308 = (pointer)0x0;
  pEStack_300 = (pointer)0x0;
  local_2f8 = &PTR_to_json_abi_cxx11__00261860;
  local_2f0 = 0xff;
  local_2ee = 0xff;
  local_2e8._0_1_ = false;
  local_2e8._1_1_ = false;
  local_2e6 = false;
  local_330._24_8_ = pEVar42;
  Entity::Entity(pEVar45,(Attributes *)local_330);
  Map::add_entity(pMVar3,pEVar45);
  if (pEStack_310 != (pointer)0x0) {
    operator_delete(pEStack_310,(long)pEStack_300 - (long)pEStack_310);
  }
  pEVar45 = (Entity *)operator_new(0x58);
  local_120._0_8_ = (pointer)0x107151513;
  local_120[8] = '\x02';
  local_120._18_2_ = 0;
  local_120[9] = '\0';
  local_120[10] = false;
  local_120[0xb] = false;
  local_120[0xc] = false;
  local_120[0xd] = false;
  local_120[0xe] = false;
  local_120[0xf] = false;
  local_120[0x10] = '\0';
  pEStack_100 = (pointer)0x0;
  pEStack_f8 = (pointer)0x0;
  pEStack_f0 = (pointer)0x0;
  local_e8 = &PTR_to_json_abi_cxx11__00261860;
  local_e0 = 0xff;
  local_de = 0xff;
  local_d8._0_1_ = false;
  local_d8._1_1_ = false;
  local_d6 = false;
  local_120._24_8_ = pEVar42;
  Entity::Entity(pEVar45,(Attributes *)local_120);
  Map::add_entity(pMVar3,pEVar45);
  if (pEStack_100 != (pointer)0x0) {
    operator_delete(pEStack_100,(long)pEStack_f0 - (long)pEStack_100);
  }
  pEVar45 = (Entity *)operator_new(0x58);
  local_188._0_8_ = (void *)0x107151613;
  local_188.palette = '\x02';
  local_188.behavior_id = 0;
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = false;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  local_188.entity_to_use_tiles_from = pEVar42;
  Entity::Entity(pEVar45,&local_188);
  Map::add_entity(pMVar3,pEVar45);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar45 = (Entity *)operator_new(0x58);
  local_d0.type_id = 0x99;
  local_d0.position.x = '\x19';
  local_d0.position.y = '\x15';
  local_d0.position.z = '\a';
  local_d0.position.half_x = false;
  local_d0.position.half_y = false;
  local_d0.position.half_z = false;
  local_d0.orientation = '\0';
  local_d0.palette = '\x01';
  local_d0.behavior_id = 0;
  local_d0.speed = '\0';
  local_d0.fightable = false;
  local_d0.liftable = false;
  local_d0.can_pass_through = false;
  local_d0.appear_after_player_moved_away = false;
  local_d0.gravity_immune = false;
  local_d0.talkable = false;
  local_d0.dialogue = '\0';
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_d0.persistence_flag.byte = 0xff;
  local_d0.persistence_flag.bit = 0xff;
  local_d0.flag_unknown_2_3 = false;
  local_d0.flag_unknown_2_4 = false;
  local_d0.flag_unknown_3_5 = false;
  local_d0.entity_to_use_tiles_from = pEVar42;
  Entity::Entity(pEVar45,&local_d0);
  Map::add_entity(pMVar3,pEVar45);
  if (local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar42 = (Entity *)operator_new(0x58);
  local_80[0] = '\\';
  local_80[1] = '\x10';
  local_80[2] = '\x1c';
  local_80[3] = '\x01';
  local_80[4] = true;
  local_80[5] = true;
  local_80._18_2_ = 0;
  local_80[6] = false;
  local_80[7] = '\0';
  local_80[8] = '\0';
  local_80[9] = '\0';
  local_80[10] = false;
  local_80[0xb] = false;
  local_80[0xc] = false;
  local_80[0xd] = false;
  local_80[0xe] = false;
  local_80[0xf] = false;
  local_80[0x10] = '\0';
  local_80._24_8_ = (Entity *)0x0;
  pEStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pEStack_50 = (pointer)0x0;
  local_48 = &PTR_to_json_abi_cxx11__00261860;
  local_40 = 0xff;
  local_3e = 0xff;
  local_38._0_1_ = false;
  local_38._1_1_ = false;
  local_36 = false;
  Entity::Entity(pEVar42,(Attributes *)local_80);
  if (pEStack_60 != (pointer)0x0) {
    operator_delete(pEStack_60,(long)pEStack_50 - (long)pEStack_60);
  }
  local_339 = false;
  local_128 = CONCAT44(local_128._4_4_,0x2c);
  std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
  emplace_back<bool,int,unsigned_char_const&>
            ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)&(pEVar42->_attrs).mask_flags,
             &local_339,(int *)&local_128,&FLAG_ALL_VALID_EQUIPMENTS.bit);
  Map::add_entity(pMVar3,pEVar42);
  local_338->_room_1 = pMVar3;
  local_290._0_2_ = 0x8b;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3 = *ppMVar41;
  (pMVar3->_visited_flag).byte = 0xc0;
  (pMVar3->_visited_flag).bit = '\0';
  local_290._0_2_ = 0x74;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3->_layout = (*ppMVar41)->_layout;
  local_290._0_2_ = 0x74;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3->_blockset = (*ppMVar41)->_blockset;
  pMVar3->_palette = (MapPalette *)local_348;
  pMVar3->_background_music = '\n';
  pEVar42 = (Entity *)operator_new(0x58);
  local_290._0_2_ = 0x10e4;
  local_290[2] = '\x19';
  local_290[3] = true;
  local_290[4] = true;
  local_290[5] = true;
  local_290[6] = false;
  local_290[7] = '\0';
  local_290[8] = '\x01';
  local_290[9] = '\0';
  local_290[10] = false;
  local_290[0xb] = true;
  local_290[0xc] = false;
  local_290[0xd] = false;
  local_290[0xe] = false;
  local_290[0xf] = false;
  local_290._18_2_ = 0;
  local_290[0x10] = '\0';
  local_290._24_8_ = (Entity *)0x0;
  pEStack_270 = (pointer)0x0;
  local_268 = (pointer)0x0;
  auStack_260._0_8_ = (pointer)0x0;
  auStack_260._8_8_ = &PTR_to_json_abi_cxx11__00261860;
  local_250 = (undefined4 *)CONCAT53(local_250._3_5_,0xff00ff);
  local_248 = local_248 & 0xffffffffff000000;
  Entity::Entity(pEVar42,(Attributes *)local_290);
  if (pEStack_270 != (pointer)0x0) {
    operator_delete(pEStack_270,auStack_260._0_8_ - (long)pEStack_270);
  }
  Map::add_entity(pMVar3,pEVar42);
  pEVar42 = (Entity *)operator_new(0x58);
  local_398[0] = 0xec;
  local_398[1] = '\x10';
  local_398[2] = '\x13';
  local_398[3] = '\x01';
  local_398[4] = true;
  local_398[5] = true;
  local_398[6] = false;
  local_398[7] = '\0';
  local_398[8] = '\x01';
  local_398[9] = '\0';
  local_398[10] = false;
  local_398[0xb] = true;
  local_398[0xc] = false;
  local_398[0xd] = false;
  local_398[0xe] = false;
  local_398[0xf] = false;
  local_398._18_2_ = 0;
  local_398[0x10] = '\0';
  local_398._24_8_ = 0;
  pEStack_378 = (pointer)0x0;
  local_370 = (pointer)0x0;
  pEStack_368 = (pointer)0x0;
  local_360 = &PTR_to_json_abi_cxx11__00261860;
  local_358 = 0xff;
  local_356 = 0xff;
  local_350._0_1_ = false;
  local_350._1_1_ = false;
  local_34e = false;
  Entity::Entity(pEVar42,(Attributes *)local_398);
  if (pEStack_378 != (pointer)0x0) {
    operator_delete(pEStack_378,(long)pEStack_368 - (long)pEStack_378);
  }
  Map::add_entity(pMVar3,pEVar42);
  local_338->_room_2 = pMVar3;
  local_338->_room_1->_fall_destination = pMVar3->_id;
  local_290._0_2_ = 0x8c;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3 = *ppMVar41;
  (pMVar3->_visited_flag).byte = 0xc0;
  (pMVar3->_visited_flag).bit = '\0';
  local_290._0_2_ = 0x82;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3->_layout = (*ppMVar41)->_layout;
  local_290._0_2_ = 0x82;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3->_blockset = (*ppMVar41)->_blockset;
  pMVar3->_palette = (MapPalette *)local_348;
  pMVar3->_background_music = '\n';
  pEVar42 = (Entity *)operator_new(0x58);
  local_290._0_2_ = 0x255c;
  local_290[2] = '\x1f';
  local_290[3] = true;
  local_290[4] = true;
  local_290[5] = true;
  local_290._18_2_ = 0;
  local_290[6] = false;
  local_290[7] = '\0';
  local_290[8] = '\0';
  local_290[9] = '\0';
  local_290[10] = false;
  local_290[0xb] = false;
  local_290[0xc] = false;
  local_290[0xd] = false;
  local_290[0xe] = false;
  local_290[0xf] = false;
  local_290[0x10] = '\0';
  local_290._24_8_ = (Entity *)0x0;
  pEStack_270 = (pointer)0x0;
  local_268 = (pointer)0x0;
  auStack_260._0_8_ = (pointer)0x0;
  auStack_260._8_8_ = &PTR_to_json_abi_cxx11__00261860;
  local_250 = (undefined4 *)CONCAT53(local_250._3_5_,0xff00ff);
  local_248 = local_248 & 0xffffffffff000000;
  Entity::Entity(pEVar42,(Attributes *)local_290);
  if (pEStack_270 != (pointer)0x0) {
    operator_delete(pEStack_270,auStack_260._0_8_ - (long)pEStack_270);
  }
  Map::add_entity(pMVar3,pEVar42);
  pEVar45 = (Entity *)operator_new(0x58);
  local_398[0] = '\\';
  local_398[1] = '%';
  local_398[2] = '\x17';
  local_398[3] = '\x01';
  local_398[4] = true;
  local_398[5] = true;
  local_398._18_2_ = 0;
  local_398[6] = false;
  local_398[7] = '\0';
  local_398[8] = '\0';
  local_398[9] = '\0';
  local_398[10] = false;
  local_398[0xb] = false;
  local_398[0xc] = false;
  local_398[0xd] = false;
  local_398[0xe] = false;
  local_398[0xf] = false;
  local_398[0x10] = '\0';
  pEStack_378 = (pointer)0x0;
  local_370 = (pointer)0x0;
  pEStack_368 = (pointer)0x0;
  local_360 = &PTR_to_json_abi_cxx11__00261860;
  local_358 = 0xff;
  local_356 = 0xff;
  local_350._0_1_ = false;
  local_350._1_1_ = false;
  local_34e = false;
  local_398._24_8_ = pEVar42;
  Entity::Entity(pEVar45,(Attributes *)local_398);
  if (pEStack_378 != (pointer)0x0) {
    operator_delete(pEStack_378,(long)pEStack_368 - (long)pEStack_378);
  }
  Map::add_entity(pMVar3,pEVar45);
  pEVar42 = (Entity *)operator_new(0x58);
  local_2e0[0] = true;
  local_2e0[1] = '%';
  local_2e0[2] = '\x1c';
  local_2e0[3] = '\x02';
  local_2e0[4] = false;
  local_2e0[5] = false;
  local_2e0[6] = false;
  local_2e0[7] = '\x01';
  local_2e0._18_2_ = 0;
  local_2e0[8] = '\x03';
  local_2e0[9] = '\0';
  local_2e0[10] = false;
  local_2e0[0xb] = false;
  local_2e0[0xc] = false;
  local_2e0[0xd] = false;
  local_2e0[0xe] = false;
  local_2e0[0xf] = false;
  local_2e0[0x10] = '\0';
  local_2e0._24_8_ = (Entity *)0x0;
  pEStack_2c0 = (pointer)0x0;
  pEStack_2b8 = (pointer)0x0;
  pEStack_2b0 = (pointer)0x0;
  local_2a8 = &PTR_to_json_abi_cxx11__00261860;
  local_2a0 = 0xff;
  local_29e = 0xff;
  local_298._0_1_ = false;
  local_298._1_1_ = false;
  local_296 = false;
  Entity::Entity(pEVar42,(Attributes *)local_2e0);
  if (pEStack_2c0 != (pointer)0x0) {
    operator_delete(pEStack_2c0,(long)pEStack_2b0 - (long)pEStack_2c0);
  }
  local_120[0] = '\x01';
  local_330._0_4_ = 0x2c;
  std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
  emplace_back<bool,int,unsigned_char_const&>
            ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)&(pEVar42->_attrs).mask_flags,
             (bool *)local_120,(int *)local_330,&FLAG_FOUND_GNOME_1.bit);
  Map::add_entity(pMVar3,pEVar42);
  pEVar45 = (Entity *)operator_new(0x58);
  local_330._0_8_ = (pointer)0x200000002172984;
  local_330[8] = '\x03';
  local_330._18_2_ = 0;
  local_330[9] = '\0';
  local_330[10] = false;
  local_330[0xb] = false;
  local_330[0xc] = false;
  local_330[0xd] = false;
  local_330[0xe] = false;
  local_330[0xf] = false;
  local_330[0x10] = '\0';
  pEStack_310 = (pointer)0x0;
  pEStack_308 = (pointer)0x0;
  pEStack_300 = (pointer)0x0;
  local_2f8 = &PTR_to_json_abi_cxx11__00261860;
  local_2f0 = 0xff;
  local_2ee = 0xff;
  local_2e8._0_1_ = false;
  local_2e8._1_1_ = false;
  local_2e6 = false;
  local_330._24_8_ = pEVar42;
  Entity::Entity(pEVar45,(Attributes *)local_330);
  if (pEStack_310 != (pointer)0x0) {
    operator_delete(pEStack_310,(long)pEStack_300 - (long)pEStack_310);
  }
  local_188.type_id = '\x01';
  local_120._0_4_ = 0x2c;
  std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
  emplace_back<bool,int,unsigned_char_const&>
            ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)&(pEVar45->_attrs).mask_flags,
             (bool *)&local_188,(int *)local_120,&FLAG_FOUND_GNOME_2.bit);
  Map::add_entity(pMVar3,pEVar45);
  pEVar42 = (Entity *)operator_new(0x58);
  local_120._0_8_ = (pointer)0x2232684;
  local_120[8] = '\x03';
  local_120._18_2_ = 0;
  local_120[9] = '\0';
  local_120[10] = false;
  local_120[0xb] = false;
  local_120[0xc] = false;
  local_120[0xd] = false;
  local_120[0xe] = false;
  local_120[0xf] = false;
  local_120[0x10] = '\0';
  local_120._24_8_ = (Entity *)0x0;
  pEStack_100 = (pointer)0x0;
  pEStack_f8 = (pointer)0x0;
  pEStack_f0 = (pointer)0x0;
  local_e8 = &PTR_to_json_abi_cxx11__00261860;
  local_e0 = 0xff;
  local_de = 0xff;
  local_d8._0_1_ = false;
  local_d8._1_1_ = false;
  local_d6 = false;
  Entity::Entity(pEVar42,(Attributes *)local_120);
  if (pEStack_100 != (pointer)0x0) {
    operator_delete(pEStack_100,(long)pEStack_f0 - (long)pEStack_100);
  }
  local_d0.type_id = '\x01';
  local_188._0_4_ = 0x2c;
  std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
  emplace_back<bool,int,unsigned_char_const&>
            ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)&(pEVar42->_attrs).mask_flags,
             (bool *)&local_d0,(int *)&local_188,&FLAG_FOUND_GNOME_3.bit);
  Map::add_entity(pMVar3,pEVar42);
  pEVar45 = (Entity *)operator_new(0x58);
  local_188._0_8_ = (void *)0x300000002202884;
  local_188.palette = '\x03';
  local_188.behavior_id = 0;
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = false;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  local_188.entity_to_use_tiles_from = pEVar42;
  Entity::Entity(pEVar45,&local_188);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_80[0] = '\x01';
  local_d0._0_4_ = 0x2c;
  std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
  emplace_back<bool,int,unsigned_char_const&>
            ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)&(pEVar45->_attrs).mask_flags,
             (bool *)local_80,(int *)&local_d0,&FLAG_FOUND_GNOME_4.bit);
  Map::add_entity(pMVar3,pEVar45);
  pEVar42 = (Entity *)operator_new(0x58);
  local_d0.type_id = 0x9c;
  local_d0.position.x = '%';
  local_d0.position.y = '\x1a';
  local_d0.position.z = '\x02';
  local_d0.position.half_x = false;
  local_d0.position.half_y = false;
  local_d0.position.half_z = false;
  local_d0.orientation = '\x01';
  local_d0.palette = '\x01';
  local_d0.behavior_id = 0;
  local_d0.speed = '\0';
  local_d0.fightable = false;
  local_d0.liftable = false;
  local_d0.can_pass_through = false;
  local_d0.appear_after_player_moved_away = false;
  local_d0.gravity_immune = false;
  local_d0.talkable = false;
  local_d0.dialogue = '\0';
  local_d0.entity_to_use_tiles_from = (Entity *)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_d0.persistence_flag.byte = 0xff;
  local_d0.persistence_flag.bit = 0xff;
  local_d0.flag_unknown_2_3 = false;
  local_d0.flag_unknown_2_4 = false;
  local_d0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar42,&local_d0);
  if (local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Map::add_entity(pMVar3,pEVar42);
  puVar53 = local_80 + 0x10;
  local_80._0_4_ = SUB84(puVar53,0);
  local_80._4_2_ = (undefined2)((ulong)puVar53 >> 0x20);
  local_80._6_2_ = (undefined2)((ulong)puVar53 >> 0x30);
  local_128 = 0xfa;
  pcVar43 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                      &local_128,0);
  sVar10 = local_128;
  local_80._0_4_ = SUB84(pcVar43,0);
  local_80._4_2_ = (undefined2)((ulong)pcVar43 >> 0x20);
  local_80._6_2_ = (undefined2)((ulong)pcVar43 >> 0x30);
  local_80[0x10] = (undefined1)local_128;
  local_80[0x11] = (undefined1)(local_128 >> 8);
  local_80._18_2_ = (undefined2)(local_128 >> 0x10);
  local_80._20_4_ = (undefined4)(local_128 >> 0x20);
  memcpy(pcVar43,
         "Foxy: As you have heard\nfrom our mutual friend Nole,\x1e\nhe needs someone strong enough\nto break Gola\'s curse\nonce and for all.\x1e\nFour gnomes happen to have left\nGreenmaze and are causing\na ruckus in Mercator.\x1e\nBring them all back,\nand you shall pass...\x03"
         ,0xfa);
  local_80._8_5_ = (undefined5)sVar10;
  local_80[0xd] = SUB81(sVar10 >> 0x28,0);
  local_80._14_2_ = (undefined2)(sVar10 >> 0x30);
  pcVar43[sVar10] = '\0';
  RandomizerWorld::add_custom_dialogue_raw((RandomizerWorld *)w,pEVar42,(string *)local_80);
  puVar16 = (undefined1 *)CONCAT26(local_80._6_2_,CONCAT24(local_80._4_2_,local_80._0_4_));
  if (puVar16 != puVar53) {
    operator_delete(puVar16,CONCAT44(local_80._20_4_,
                                     CONCAT22(local_80._18_2_,
                                              CONCAT11(local_80[0x11],local_80[0x10]))) + 1);
  }
  local_338->_room_3 = pMVar3;
  local_190 = &w->_map_connections;
  local_290._0_2_ = local_338->_room_2->_id;
  local_290[2] = '\x12';
  local_290[3] = '\x0f';
  local_290[4] = false;
  local_290[6] = SUB21(pMVar3->_id,0);
  local_290[7] = (uint8_t)(pMVar3->_id >> 8);
  local_290[8] = '(';
  local_290[9] = '%';
  local_290[10] = false;
  iVar7._M_current =
       (w->_map_connections).super__Vector_base<MapConnection,_std::allocator<MapConnection>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (w->_map_connections).super__Vector_base<MapConnection,_std::allocator<MapConnection>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_190,iVar7,(MapConnection *)local_290);
  }
  else {
    (iVar7._M_current)->_pos_x_2 = (char)0x2528;
    (iVar7._M_current)->_pos_y_2 = (char)(0x2528 >> 8);
    (iVar7._M_current)->_extra_byte_2 = (char)(0x2528 >> 0x10);
    (iVar7._M_current)->field_0xb = local_290[0xb];
    uVar30 = (uint5)CONCAT13(0xf,CONCAT12(0x12,local_290._0_2_));
    (iVar7._M_current)->_map_id_1 = (short)uVar30;
    (iVar7._M_current)->_pos_x_1 = (char)(uVar30 >> 0x10);
    (iVar7._M_current)->_pos_y_1 = (char)(uVar30 >> 0x18);
    (iVar7._M_current)->_extra_byte_1 = (char)(uVar30 >> 0x20);
    (iVar7._M_current)->field_0x5 = local_290[5];
    (iVar7._M_current)->_map_id_2 =
         (short)(CONCAT17(local_290[7],CONCAT16(local_290[6],CONCAT15(local_290[5],uVar30))) >> 0x30
                );
    ppMVar1 = &(w->_map_connections).
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  pEVar42 = (Entity *)operator_new(0x58);
  local_290._0_2_ = 0x2184;
  local_290[2] = '&';
  local_290[3] = true;
  local_290[4] = false;
  local_290[5] = false;
  local_290[6] = false;
  local_290[7] = '\x03';
  local_290[8] = '\x03';
  local_290[9] = '\0';
  local_290[10] = false;
  local_290[0xb] = false;
  local_290[0xc] = false;
  local_290[0xd] = false;
  local_290[0xe] = false;
  local_290[0xf] = true;
  local_290[0x10] = '\x01';
  local_290._18_2_ = 0;
  local_290._24_8_ = (Entity *)0x0;
  pEStack_270 = (pointer)0x0;
  local_268 = (pointer)0x0;
  auStack_260._0_8_ = (pointer)0x0;
  auStack_260._8_8_ = &PTR_to_json_abi_cxx11__00261860;
  local_250 = (undefined4 *)CONCAT53(local_250._3_5_,0xff00ff);
  local_248 = local_248 & 0xffffffffff000000;
  Entity::Entity(pEVar42,(Attributes *)local_290);
  if (pEStack_270 != (pointer)0x0) {
    operator_delete(pEStack_270,auStack_260._0_8_ - (long)pEStack_270);
  }
  local_2e0[0] = false;
  local_398[0] = ',';
  local_398[1] = '\0';
  local_398[2] = '\0';
  local_398[3] = '\0';
  std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
  emplace_back<bool,int,unsigned_char_const&>
            ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)&(pEVar42->_attrs).mask_flags,
             (bool *)local_2e0,(int *)local_398,&FLAG_FOUND_GNOME_1.bit);
  local_398[0] = 0x94;
  local_398[1] = '\x02';
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_398);
  Map::add_entity(*ppMVar41,pEVar42);
  local_398[0] = 0x94;
  local_398[1] = '\x02';
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_398);
  pMVar3 = *ppMVar41;
  puVar53 = local_398 + 0x10;
  local_398[0] = (uint8_t)puVar53;
  local_398[1] = (byte)((ulong)puVar53 >> 8);
  local_398[2] = (byte)((ulong)puVar53 >> 0x10);
  local_398[3] = (uint8_t)((ulong)puVar53 >> 0x18);
  local_398._4_2_ = (undefined2)((ulong)puVar53 >> 0x20);
  local_398[6] = SUB81((ulong)puVar53 >> 0x30,0);
  local_398[7] = (uint8_t)((ulong)puVar53 >> 0x38);
  local_2e0[0] = true;
  local_2e0[1] = '\0';
  local_2e0[2] = '\0';
  local_2e0._3_4_ = 0;
  local_2e0[7] = '\0';
  pcVar43 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398
                      ,(size_type *)local_2e0,0);
  uVar31 = local_2e0._3_4_;
  local_398[0] = (uint8_t)pcVar43;
  local_398[1] = (byte)((ulong)pcVar43 >> 8);
  local_398[2] = (byte)((ulong)pcVar43 >> 0x10);
  local_398[3] = (uint8_t)((ulong)pcVar43 >> 0x18);
  local_398._4_2_ = (undefined2)((ulong)pcVar43 >> 0x20);
  local_398[6] = SUB81((ulong)pcVar43 >> 0x30,0);
  local_398[7] = (uint8_t)((ulong)pcVar43 >> 0x38);
  uVar17 = CONCAT12(local_2e0[2],CONCAT11(local_2e0[1],local_2e0[0]));
  uVar18 = CONCAT43(local_2e0._3_4_,uVar17);
  lVar48 = CONCAT17(local_2e0[7],uVar18);
  local_398[0x10] = local_2e0[0];
  uVar38 = local_398[0x10];
  local_398[0x11] = local_2e0[1];
  local_398._18_2_ = (undefined2)((uint7)uVar18 >> 0x10);
  local_398._20_4_ = (undefined4)((ulong)lVar48 >> 0x20);
  memcpy(pcVar43,"Gnome: Ahah, you found me!\nI was thinking about opening\na shop in here...\x03",
         0x4a);
  local_398._9_2_ = (undefined2)((uint3)uVar17 >> 8);
  local_398[0xb] = SUB41(uVar31,0);
  local_398[0xc] = SUB41(uVar31,1);
  local_398[0xd] = SUB41(uVar31,2);
  local_398._14_2_ = (undefined2)((ulong)lVar48 >> 0x30);
  pcVar43[lVar48] = '\0';
  local_398[8] = uVar38;
  add_gnome_text(pMVar3,w,&FLAG_FOUND_GNOME_1,(string *)local_398);
  puVar53 = (undefined1 *)
            CONCAT17(local_398[7],
                     CONCAT16(local_398[6],
                              CONCAT24(local_398._4_2_,
                                       CONCAT13(local_398[3],
                                                CONCAT12(local_398[2],
                                                         CONCAT11(local_398[1],local_398[0]))))));
  if (puVar53 != local_398 + 0x10) {
    operator_delete(puVar53,CONCAT44(local_398._20_4_,
                                     CONCAT22(local_398._18_2_,
                                              CONCAT11(local_398[0x11],local_398[0x10]))) + 1);
  }
  pEVar42 = (Entity *)operator_new(0x58);
  local_398[0] = 0x84;
  local_398[1] = '#';
  local_398[2] = '\x1b';
  local_398[3] = '\x01';
  local_398[4] = true;
  local_398[5] = true;
  local_398[6] = false;
  local_398[7] = '\x02';
  local_398[8] = '\x03';
  local_398[9] = '\0';
  local_398[10] = false;
  local_398[0xb] = false;
  local_398[0xc] = false;
  local_398[0xd] = false;
  local_398[0xe] = false;
  local_398[0xf] = true;
  local_398[0x10] = '\x03';
  local_398._18_2_ = 0;
  local_398._24_8_ = 0;
  pEStack_378 = (pointer)0x0;
  local_370 = (pointer)0x0;
  pEStack_368 = (pointer)0x0;
  local_360 = &PTR_to_json_abi_cxx11__00261860;
  local_358 = 0xff;
  local_356 = 0xff;
  local_350._0_1_ = false;
  local_350._1_1_ = false;
  local_34e = false;
  Entity::Entity(pEVar42,(Attributes *)local_398);
  if (pEStack_378 != (pointer)0x0) {
    operator_delete(pEStack_378,(long)pEStack_368 - (long)pEStack_378);
  }
  local_330._0_8_ = local_330._0_8_ & 0xffffffffffffff00;
  local_2e0[0] = true;
  local_2e0[1] = '\0';
  local_2e0[2] = '\0';
  local_2e0._3_4_ = local_2e0._3_4_ & 0xffffff00;
  std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
  emplace_back<bool,int,unsigned_char_const&>
            ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)&(pEVar42->_attrs).mask_flags,
             (bool *)local_330,(int *)local_2e0,&FLAG_FOUND_GNOME_2.bit);
  local_2e0[0] = true;
  local_2e0[1] = '\0';
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_2e0);
  Map::add_entity(*ppMVar41,pEVar42);
  local_2e0[0] = true;
  local_2e0[1] = '\0';
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_2e0);
  pMVar3 = *ppMVar41;
  puVar53 = local_2e0 + 0x10;
  local_2e0[0] = SUB81(puVar53,0);
  local_2e0[1] = (uint8_t)((ulong)puVar53 >> 8);
  local_2e0[2] = (uint8_t)((ulong)puVar53 >> 0x10);
  local_2e0._3_4_ = (undefined4)((ulong)puVar53 >> 0x18);
  local_2e0[7] = (uint8_t)((ulong)puVar53 >> 0x38);
  local_330._0_8_ = (pointer)0x51;
  pcVar43 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0
                      ,(size_type *)local_330,0);
  uVar11 = local_330._0_8_;
  local_2e0[0] = SUB81(pcVar43,0);
  local_2e0[1] = (uint8_t)((ulong)pcVar43 >> 8);
  local_2e0[2] = (uint8_t)((ulong)pcVar43 >> 0x10);
  local_2e0._3_4_ = (undefined4)((ulong)pcVar43 >> 0x18);
  local_2e0[7] = (uint8_t)((ulong)pcVar43 >> 0x38);
  local_2e0[0x10] = (undefined1)local_330._0_8_;
  local_2e0[0x11] = SUB81(local_330._0_8_,1);
  local_2e0._18_2_ = SUB82(local_330._0_8_,2);
  local_2e0._20_4_ = SUB84(local_330._0_8_,4);
  uVar31 = local_2e0._20_4_;
  memcpy(pcVar43,
         "Gnome: Ahah, you found me!\nThese smashing and spinning\nboulders are so much fun!\x03",
         0x51);
  local_2e0._8_4_ = (undefined4)uVar11;
  pcVar43[uVar11] = '\0';
  local_2e0._12_4_ = uVar31;
  add_gnome_text(pMVar3,w,&FLAG_FOUND_GNOME_2,(string *)local_2e0);
  puVar53 = (undefined1 *)
            CONCAT17(local_2e0[7],
                     CONCAT43(local_2e0._3_4_,
                              CONCAT12(local_2e0[2],CONCAT11(local_2e0[1],local_2e0[0]))));
  if (puVar53 != local_2e0 + 0x10) {
    operator_delete(puVar53,CONCAT44(local_2e0._20_4_,
                                     CONCAT22(local_2e0._18_2_,
                                              CONCAT11(local_2e0[0x11],local_2e0[0x10]))) + 1);
  }
  pEVar42 = (Entity *)operator_new(0x58);
  local_2e0[0] = true;
  local_2e0[1] = '\x17';
  local_2e0[2] = '\x13';
  local_2e0[3] = '\0';
  local_2e0[4] = false;
  local_2e0[5] = false;
  local_2e0[6] = false;
  local_2e0[7] = '\x03';
  local_2e0[8] = '\x03';
  local_2e0[9] = '\0';
  local_2e0[10] = false;
  local_2e0[0xb] = false;
  local_2e0[0xc] = false;
  local_2e0[0xd] = false;
  local_2e0[0xe] = false;
  local_2e0[0xf] = true;
  local_2e0[0x10] = '\x04';
  local_2e0._18_2_ = 0;
  local_2e0._24_8_ = (Entity *)0x0;
  pEStack_2c0 = (pointer)0x0;
  pEStack_2b8 = (pointer)0x0;
  pEStack_2b0 = (pointer)0x0;
  local_2a8 = &PTR_to_json_abi_cxx11__00261860;
  local_2a0 = 0xff;
  local_29e = 0xff;
  local_298._0_1_ = false;
  local_298._1_1_ = false;
  local_296 = false;
  Entity::Entity(pEVar42,(Attributes *)local_2e0);
  if (pEStack_2c0 != (pointer)0x0) {
    operator_delete(pEStack_2c0,(long)pEStack_2b0 - (long)pEStack_2c0);
  }
  local_120._0_8_ = local_120._0_8_ & 0xffffffffffffff00;
  local_330._0_4_ = 0x2c;
  std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
  emplace_back<bool,int,unsigned_char_const&>
            ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)&(pEVar42->_attrs).mask_flags,
             (bool *)local_120,(int *)local_330,&FLAG_FOUND_GNOME_3.bit);
  local_330._0_2_ = 0x45;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_330);
  Map::add_entity(*ppMVar41,pEVar42);
  local_330._0_2_ = 0x44;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_330);
  pMVar3 = *ppMVar41;
  local_330._0_8_ = local_330 + 0x10;
  local_120._0_8_ = (pointer)0x57;
  pcVar43 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330
                      ,(size_type *)local_120,0);
  uVar11 = local_120._0_8_;
  local_330[0x10] = (undefined1)local_120._0_8_;
  uVar38 = local_330[0x10];
  local_330[0x11] = SUB81(local_120._0_8_,1);
  local_330._18_2_ = SUB82(local_120._0_8_,2);
  local_330._20_4_ = SUB84(local_120._0_8_,4);
  local_330._0_8_ = pcVar43;
  memcpy(pcVar43,
         "Gnome: Ahah, you found me!\nI came here because of the smell,\nand stayed for the taste.\x03"
         ,0x57);
  local_330._9_7_ = SUB87(uVar11,1);
  pcVar43[uVar11] = '\0';
  local_330[8] = uVar38;
  add_gnome_text(pMVar3,w,&FLAG_FOUND_GNOME_3,(string *)local_330);
  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
    operator_delete((void *)local_330._0_8_,
                    CONCAT44(local_330._20_4_,
                             CONCAT22(local_330._18_2_,CONCAT11(local_330[0x11],local_330[0x10]))) +
                    1);
  }
  local_330._0_2_ = 0x20;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_330);
  pMVar3 = *ppMVar41;
  ppEVar8 = (pMVar3->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar46 = (pMVar3->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppEVar46 != ppEVar8;
      ppEVar46 = ppEVar46 + 1) {
    if (((*ppEVar46)->_attrs).palette == '\x03') {
      ((*ppEVar46)->_attrs).palette = '\x01';
    }
  }
  pEVar42 = (Entity *)operator_new(0x58);
  local_330._0_8_ = (pointer)0x30000000c2e1f84;
  local_330[8] = '\x03';
  local_330[9] = '\0';
  local_330[10] = false;
  local_330[0xb] = false;
  local_330[0xc] = false;
  local_330[0xd] = false;
  local_330[0xe] = false;
  local_330[0xf] = true;
  local_330[0x10] = '\x01';
  local_330._18_2_ = 0;
  local_330._24_8_ = (Entity *)0x0;
  pEStack_310 = (pointer)0x0;
  pEStack_308 = (pointer)0x0;
  pEStack_300 = (pointer)0x0;
  local_2f8 = &PTR_to_json_abi_cxx11__00261860;
  local_2f0 = 0xff;
  local_2ee = 0xff;
  local_2e8._0_1_ = false;
  local_2e8._1_1_ = false;
  local_2e6 = false;
  Entity::Entity(pEVar42,(Attributes *)local_330);
  if (pEStack_310 != (pointer)0x0) {
    operator_delete(pEStack_310,(long)pEStack_300 - (long)pEStack_310);
  }
  local_188._0_8_ = local_188._0_8_ & 0xffffffffffffff00;
  local_120._0_4_ = 0x2c;
  std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
  emplace_back<bool,int,unsigned_char_const&>
            ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)&(pEVar42->_attrs).mask_flags,
             (bool *)&local_188,(int *)local_120,&FLAG_FOUND_GNOME_4.bit);
  Map::add_entity(pMVar3,pEVar42);
  local_188._0_8_ = (void *)0x59;
  local_120._0_8_ = local_120 + 0x10;
  pcVar43 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120
                      ,(size_type *)&local_188,0);
  uVar11 = local_188._0_8_;
  local_120[0x10] = local_188.type_id;
  uVar38 = local_120[0x10];
  local_120[0x11] = local_188.position.x;
  local_120._18_2_ = local_188.position._1_2_;
  local_120._20_4_ = local_188._4_4_;
  local_120._0_8_ = pcVar43;
  memcpy(pcVar43,
         "Gnome: Ahah, you found me!\nThe view here sure is something.\nDid you find all my friends?\x03"
         ,0x59);
  local_120._9_7_ = SUB87(uVar11,1);
  pcVar43[uVar11] = '\0';
  local_120[8] = uVar38;
  add_gnome_text(pMVar3,w,&FLAG_FOUND_GNOME_4,(string *)local_120);
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,
                    CONCAT44(local_120._20_4_,
                             CONCAT22(local_120._18_2_,CONCAT11(local_120[0x11],local_120[0x10]))) +
                    1);
  }
  local_120[0] = 0xff;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gnome_text_map_ids_table,
             local_120);
  local_120[0] = 0xff;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gnome_text_map_ids_table,
             local_120);
  local_290._0_2_ = 0x8d;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3 = *ppMVar41;
  (pMVar3->_visited_flag).byte = 0xc0;
  (pMVar3->_visited_flag).bit = '\0';
  local_290._0_2_ = 0x8a;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3->_layout = (*ppMVar41)->_layout;
  local_290._0_2_ = 0x8a;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3->_blockset = (*ppMVar41)->_blockset;
  pMVar3->_palette = (MapPalette *)local_348;
  pMVar3->_background_music = '\n';
  pEVar42 = (Entity *)operator_new(0x58);
  local_290._0_2_ = 0x145c;
  local_290[2] = '\x1d';
  local_290[3] = false;
  local_290[4] = true;
  local_290[5] = true;
  local_290[6] = true;
  local_290._18_2_ = 0;
  local_290[0xf] = false;
  local_290[0x10] = '\0';
  local_290[7] = '\0';
  local_290[8] = '\0';
  local_290[9] = '\0';
  local_290[10] = false;
  local_290[0xb] = false;
  local_290[0xc] = false;
  local_290[0xd] = false;
  local_290[0xe] = false;
  local_290._24_8_ = (Entity *)0x0;
  pEStack_270 = (pointer)0x0;
  local_268 = (pointer)0x0;
  auStack_260._0_8_ = (pointer)0x0;
  auStack_260._8_8_ = &PTR_to_json_abi_cxx11__00261860;
  local_250 = (undefined4 *)CONCAT53(local_250._3_5_,0xff00ff);
  local_248 = local_248 & 0xffffffffff000000;
  Entity::Entity(pEVar42,(Attributes *)local_290);
  if (pEStack_270 != (pointer)0x0) {
    operator_delete(pEStack_270,auStack_260._0_8_ - (long)pEStack_270);
  }
  Map::add_entity(pMVar3,pEVar42);
  pEVar42 = (Entity *)operator_new(0x58);
  local_398[0] = 'z';
  local_398[1] = 0x14;
  local_398[2] = 0x17;
  local_398[3] = '\0';
  local_398[4] = false;
  local_398[5] = false;
  local_398[6] = false;
  local_398[7] = '\x03';
  local_398[8] = '\x01';
  local_398[9] = '\0';
  local_398[10] = false;
  local_398[0xb] = false;
  local_398[0xc] = false;
  local_398[0xd] = false;
  local_398[0xe] = false;
  local_398[0xf] = true;
  local_398[0x10] = '\0';
  local_398._18_2_ = 0;
  local_398._24_8_ = 0;
  pEStack_378 = (pointer)0x0;
  local_370 = (pointer)0x0;
  pEStack_368 = (pointer)0x0;
  local_360 = &PTR_to_json_abi_cxx11__00261860;
  local_358 = 0xff;
  local_356 = 0xff;
  local_350._0_1_ = false;
  local_350._1_1_ = false;
  local_34e = false;
  Entity::Entity(pEVar42,(Attributes *)local_398);
  if (pEStack_378 != (pointer)0x0) {
    operator_delete(pEStack_378,(long)pEStack_368 - (long)pEStack_378);
  }
  Map::add_entity(pMVar3,pEVar42);
  puVar53 = local_2e0 + 0x10;
  local_2e0[0] = SUB81(puVar53,0);
  local_2e0[1] = (uint8_t)((ulong)puVar53 >> 8);
  local_2e0[2] = (uint8_t)((ulong)puVar53 >> 0x10);
  local_2e0._3_4_ = (undefined4)((ulong)puVar53 >> 0x18);
  local_2e0[7] = (uint8_t)((ulong)puVar53 >> 0x38);
  local_330._0_8_ = (pointer)0xa0;
  pcVar43 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0
                      ,(size_type *)local_330,0);
  uVar11 = local_330._0_8_;
  local_2e0[0] = SUB81(pcVar43,0);
  local_2e0[1] = (uint8_t)((ulong)pcVar43 >> 8);
  local_2e0[2] = (uint8_t)((ulong)pcVar43 >> 0x10);
  local_2e0._3_4_ = (undefined4)((ulong)pcVar43 >> 0x18);
  local_2e0[7] = (uint8_t)((ulong)pcVar43 >> 0x38);
  local_2e0[0x10] = (undefined1)local_330._0_8_;
  local_2e0[0x11] = SUB81(local_330._0_8_,1);
  local_2e0._18_2_ = SUB82(local_330._0_8_,2);
  local_2e0._20_4_ = SUB84(local_330._0_8_,4);
  uVar31 = local_2e0._20_4_;
  memcpy(pcVar43,
         "Pockets: Hello Nigel! I heard\nthere was a secret temple being\nuncovered here, so I came.\x1e\nThere are ancient writings on this\npillar, but I\'m no archeologist...\x03"
         ,0xa0);
  local_2e0._8_4_ = (undefined4)uVar11;
  pcVar43[uVar11] = '\0';
  local_2e0._12_4_ = uVar31;
  RandomizerWorld::add_custom_dialogue_raw((RandomizerWorld *)w,pEVar42,(string *)local_2e0);
  puVar53 = (undefined1 *)
            CONCAT17(local_2e0[7],
                     CONCAT43(local_2e0._3_4_,
                              CONCAT12(local_2e0[2],CONCAT11(local_2e0[1],local_2e0[0]))));
  if (puVar53 != local_2e0 + 0x10) {
    operator_delete(puVar53,CONCAT44(local_2e0._20_4_,
                                     CONCAT22(local_2e0._18_2_,
                                              CONCAT11(local_2e0[0x11],local_2e0[0x10]))) + 1);
  }
  local_338->_room_4 = pMVar3;
  local_290._0_2_ = local_338->_room_3->_id;
  local_290[2] = '%';
  local_290[3] = 0x1a;
  local_290[4] = false;
  local_290[6] = SUB21(pMVar3->_id,0);
  local_290[7] = (uint8_t)(pMVar3->_id >> 8);
  local_290[8] = '\x1a';
  local_290[9] = '\x13';
  local_290[10] = false;
  iVar7._M_current =
       (w->_map_connections).super__Vector_base<MapConnection,_std::allocator<MapConnection>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (w->_map_connections).super__Vector_base<MapConnection,_std::allocator<MapConnection>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_190,iVar7,(MapConnection *)local_290);
  }
  else {
    (iVar7._M_current)->_pos_x_2 = (char)0x131a;
    (iVar7._M_current)->_pos_y_2 = (char)(0x131a >> 8);
    (iVar7._M_current)->_extra_byte_2 = (char)(0x131a >> 0x10);
    (iVar7._M_current)->field_0xb = local_290[0xb];
    uVar30 = (uint5)CONCAT13(0x1a,CONCAT12(0x25,local_290._0_2_));
    (iVar7._M_current)->_map_id_1 = (short)uVar30;
    (iVar7._M_current)->_pos_x_1 = (char)(uVar30 >> 0x10);
    (iVar7._M_current)->_pos_y_1 = (char)(uVar30 >> 0x18);
    (iVar7._M_current)->_extra_byte_1 = (char)(uVar30 >> 0x20);
    (iVar7._M_current)->field_0x5 = local_290[5];
    (iVar7._M_current)->_map_id_2 =
         (short)(CONCAT17(local_290[7],CONCAT16(local_290[6],CONCAT15(local_290[5],uVar30))) >> 0x30
                );
    ppMVar1 = &(w->_map_connections).
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  local_290._0_2_ = 0x8e;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar9 = *ppMVar41;
  (pMVar9->_visited_flag).byte = 0xc0;
  (pMVar9->_visited_flag).bit = '\0';
  local_290._0_2_ = 0x15b;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar9->_layout = (*ppMVar41)->_layout;
  local_290._0_2_ = 0x15b;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar9->_blockset = (*ppMVar41)->_blockset;
  pMVar9->_palette = local_130;
  pMVar9->_background_music = '\n';
  bVar52 = 0;
  local_348 = pMVar9;
  do {
    bVar52 = bVar52 + 2;
    pEVar42 = (Entity *)operator_new(0x58);
    local_290._0_2_ = 0x1362;
    local_290[2] = '\x19';
    local_290._18_2_ = 0;
    local_290[4] = false;
    local_290[5] = false;
    local_290[6] = false;
    local_290[7] = '\0';
    local_290[8] = '\0';
    local_290[9] = '\0';
    local_290[10] = false;
    local_290[0xb] = false;
    local_290[0xc] = false;
    local_290[0xd] = false;
    local_290[0xe] = false;
    local_290[0xf] = false;
    local_290[0x10] = '\0';
    local_268 = (pointer)0x0;
    auStack_260._0_8_ = (pointer)0x0;
    local_290._24_8_ = (Entity *)0x0;
    pEStack_270 = (pointer)0x0;
    auStack_260._8_8_ = &PTR_to_json_abi_cxx11__00261860;
    local_250 = (undefined4 *)CONCAT53(local_250._3_5_,0xff00ff);
    local_248 = local_248 & 0xffffffffff000000;
    local_290[3] = bVar52;
    Entity::Entity(pEVar42,(Attributes *)local_290);
    Map::add_entity(local_348,pEVar42);
    if (pEStack_270 != (pointer)0x0) {
      operator_delete(pEStack_270,auStack_260._0_8_ - (long)pEStack_270);
    }
  } while (bVar52 < 5);
  bVar52 = 0x13;
  do {
    bVar55 = 0x13;
    do {
      pEVar42 = (Entity *)operator_new(0x58);
      local_398[0] = 0xd4;
      local_398[3] = '\x1f';
      local_398[4] = true;
      local_398[5] = true;
      local_398[6] = false;
      local_398[7] = '\0';
      local_398[8] = '\x01';
      local_398[9] = '\0';
      local_398[10] = false;
      local_398[0xb] = true;
      local_398._18_2_ = 0;
      local_398[0x10] = '\0';
      local_398[0xc] = false;
      local_398[0xd] = false;
      local_398[0xe] = false;
      local_398[0xf] = false;
      local_370 = (pointer)0x0;
      pEStack_368 = (pointer)0x0;
      local_398._24_8_ = 0;
      pEStack_378 = (pointer)0x0;
      local_360 = &PTR_to_json_abi_cxx11__00261860;
      local_358 = 0xff;
      local_356 = 0xff;
      local_350._0_1_ = false;
      local_350._1_1_ = false;
      local_34e = false;
      local_398[1] = bVar52;
      local_398[2] = bVar55;
      Entity::Entity(pEVar42,(Attributes *)local_398);
      Map::add_entity(local_348,pEVar42);
      if (pEStack_378 != (pointer)0x0) {
        operator_delete(pEStack_378,(long)pEStack_368 - (long)pEStack_378);
      }
      pMVar9 = local_348;
      bVar56 = bVar55 < 0x14;
      bVar55 = bVar55 + 0xc;
    } while (bVar56);
    bVar56 = bVar52 < 0x14;
    bVar52 = bVar52 + 0xc;
  } while (bVar56);
  local_2e0[8] = '>';
  local_2e0[9] = '\0';
  local_2e0[10] = false;
  local_2e0[0xb] = false;
  local_2e0[0] = true;
  local_2e0[1] = '\x1b';
  local_2e0[2] = '&';
  local_2e0[3] = '\0';
  local_2e0[4] = false;
  local_2e0[5] = false;
  local_2e0[6] = false;
  local_2e0[7] = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&local_348->_global_entity_mask_flags,(GlobalEntityMaskFlag *)local_2e0);
  local_338->_room_5 = pMVar9;
  local_290._0_2_ = local_338->_room_4->_id;
  uVar2 = pMVar9->_id;
  local_290[2] = '\x15';
  local_290[3] = '\x15';
  local_290[4] = true;
  local_290[6] = SUB21(uVar2,0);
  local_290[7] = (uint8_t)(uVar2 >> 8);
  local_290[8] = '\x19';
  local_290[9] = '\"';
  local_290[10] = false;
  iVar7._M_current =
       (w->_map_connections).super__Vector_base<MapConnection,_std::allocator<MapConnection>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (w->_map_connections).super__Vector_base<MapConnection,_std::allocator<MapConnection>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_190,iVar7,(MapConnection *)local_290);
  }
  else {
    (iVar7._M_current)->_pos_x_2 = (char)0x2219;
    (iVar7._M_current)->_pos_y_2 = (char)(0x2219 >> 8);
    (iVar7._M_current)->_extra_byte_2 = (char)(0x2219 >> 0x10);
    (iVar7._M_current)->field_0xb = local_290[0xb];
    (iVar7._M_current)->_map_id_1 = local_290._0_2_;
    (iVar7._M_current)->_pos_x_1 = 0x15;
    (iVar7._M_current)->_pos_y_1 = 0x15;
    (iVar7._M_current)->_extra_byte_1 = 2;
    (iVar7._M_current)->field_0x5 = local_290[5];
    (iVar7._M_current)->_map_id_2 =
         (short)(CONCAT17(local_290[7],
                          CONCAT16(local_290[6],
                                   CONCAT15(local_290[5],
                                            CONCAT14(2,CONCAT13(0x15,CONCAT12(0x15,local_290._0_2_))
                                                    )))) >> 0x30);
    ppMVar1 = &(w->_map_connections).
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  puVar53 = local_398 + 0x10;
  local_290._0_2_ = 0x8f;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3 = *ppMVar41;
  local_290._0_2_ = 0x13f;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3->_layout = (*ppMVar41)->_layout;
  local_290._0_2_ = 0x13f;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_290);
  pMVar3->_blockset = (*ppMVar41)->_blockset;
  (pMVar3->_visited_flag).bit = '\0';
  (pMVar3->_visited_flag).byte = 0x3e;
  pMVar3->_palette = local_130;
  pMVar3->_background_music = '\n';
  pEVar42 = (Entity *)operator_new(0x58);
  local_290._0_2_ = 0x13a5;
  local_290[2] = '\x19';
  local_290[3] = '\x05';
  local_290[4] = false;
  local_290[5] = false;
  local_290[6] = false;
  local_290[7] = '\x01';
  local_290[8] = '\x01';
  local_290._18_2_ = 0;
  local_290[9] = '\0';
  local_290[10] = false;
  local_290[0xb] = false;
  local_290[0xc] = false;
  local_290[0xd] = false;
  local_290[0xe] = false;
  local_290[0xf] = false;
  local_290[0x10] = '\0';
  local_290._24_8_ = (Entity *)0x0;
  pEStack_270 = (pointer)0x0;
  local_268 = (pointer)0x0;
  auStack_260._0_8_ = (pointer)0x0;
  auStack_260._8_8_ = &PTR_to_json_abi_cxx11__00261860;
  local_250 = (undefined4 *)CONCAT53(local_250._3_5_,0xff00ff);
  local_248 = local_248 & 0xffffffffff000000;
  Entity::Entity(pEVar42,(Attributes *)local_290);
  if (pEStack_270 != (pointer)0x0) {
    operator_delete(pEStack_270,auStack_260._0_8_ - (long)pEStack_270);
  }
  (pEVar42->_attrs).fightable = false;
  (pEVar42->_attrs).behavior_id = 0;
  Map::add_entity(pMVar3,pEVar42);
  local_398[0] = (uint8_t)puVar53;
  uVar32 = local_398[0];
  local_398[1] = (byte)((ulong)puVar53 >> 8);
  uVar33 = local_398[1];
  local_398[2] = (byte)((ulong)puVar53 >> 0x10);
  uVar34 = local_398[2];
  local_398[3] = (uint8_t)((ulong)puVar53 >> 0x18);
  uVar35 = local_398[3];
  local_398._4_2_ = (undefined2)((ulong)puVar53 >> 0x20);
  uVar36 = local_398._4_2_;
  local_398[6] = SUB81((ulong)puVar53 >> 0x30,0);
  bVar56 = local_398[6];
  local_398[7] = (uint8_t)((ulong)puVar53 >> 0x38);
  uVar37 = local_398[7];
  local_2e0[0] = true;
  local_2e0[1] = '\0';
  local_2e0[2] = '\0';
  local_2e0[3] = '\0';
  local_2e0[4] = false;
  local_2e0[5] = false;
  local_2e0[6] = false;
  local_2e0[7] = '\0';
  pcVar43 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398
                      ,(size_type *)local_2e0,0);
  uVar31 = local_2e0._3_4_;
  local_398[0] = (uint8_t)pcVar43;
  local_398[1] = (byte)((ulong)pcVar43 >> 8);
  local_398[2] = (byte)((ulong)pcVar43 >> 0x10);
  local_398[3] = (uint8_t)((ulong)pcVar43 >> 0x18);
  local_398._4_2_ = (undefined2)((ulong)pcVar43 >> 0x20);
  local_398[6] = SUB81((ulong)pcVar43 >> 0x30,0);
  local_398[7] = (uint8_t)((ulong)pcVar43 >> 0x38);
  uVar17 = CONCAT12(local_2e0[2],CONCAT11(local_2e0[1],local_2e0[0]));
  uVar18 = CONCAT43(local_2e0._3_4_,uVar17);
  lVar48 = CONCAT17(local_2e0[7],uVar18);
  local_398[0x10] = local_2e0[0];
  uVar38 = local_398[0x10];
  local_398[0x11] = local_2e0[1];
  local_398._18_2_ = (undefined2)((uint7)uVar18 >> 0x10);
  local_398._20_4_ = (undefined4)((ulong)lVar48 >> 0x20);
  memcpy(pcVar43,
         "Nole: AT LAST, YOU ARE READY\nFOR THE FINAL TRIAL. TO KNOW\nWHAT TO DO,\x1e\nYOU WILL HAVE TO TALK TO HER.\nSHE HAS THE ANSWER ON HOW TO\nREACH THE HEART OF GOLA.\x1e\nPREPARE WELL BEFORE GOING THERE,\nSINCE IT WILL BE HARDER\nTHAN ANYTHING YOU EVER FACED.\x03"
         ,0xf3);
  local_398._9_2_ = (undefined2)((uint3)uVar17 >> 8);
  local_398[0xb] = SUB41(uVar31,0);
  local_398[0xc] = SUB41(uVar31,1);
  local_398[0xd] = SUB41(uVar31,2);
  local_398._14_2_ = (undefined2)((ulong)lVar48 >> 0x30);
  pcVar43[lVar48] = '\0';
  local_398[8] = uVar38;
  RandomizerWorld::add_custom_dialogue_raw((RandomizerWorld *)w,pEVar42,(string *)local_398);
  puVar16 = (undefined1 *)
            CONCAT17(local_398[7],
                     CONCAT16(local_398[6],
                              CONCAT24(local_398._4_2_,
                                       CONCAT13(local_398[3],
                                                CONCAT12(local_398[2],
                                                         CONCAT11(local_398[1],local_398[0]))))));
  if (puVar16 != puVar53) {
    operator_delete(puVar16,CONCAT44(local_398._20_4_,
                                     CONCAT22(local_398._18_2_,
                                              CONCAT11(local_398[0x11],local_398[0x10]))) + 1);
  }
  local_338->_room_6 = pMVar3;
  local_290._0_2_ = local_338->_room_5->_id;
  local_290[2] = '\x13';
  local_290[3] = '\x19';
  local_290[4] = true;
  local_290[6] = SUB21(pMVar3->_id,0);
  local_290[7] = (uint8_t)(pMVar3->_id >> 8);
  local_290[8] = '\"';
  local_290[9] = '\x19';
  local_290[10] = false;
  iVar7._M_current =
       (w->_map_connections).super__Vector_base<MapConnection,_std::allocator<MapConnection>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (w->_map_connections).super__Vector_base<MapConnection,_std::allocator<MapConnection>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_190,iVar7,(MapConnection *)local_290);
  }
  else {
    (iVar7._M_current)->_pos_x_2 = (char)0x1922;
    (iVar7._M_current)->_pos_y_2 = (char)(0x1922 >> 8);
    (iVar7._M_current)->_extra_byte_2 = (char)(0x1922 >> 0x10);
    (iVar7._M_current)->field_0xb = local_290[0xb];
    (iVar7._M_current)->_map_id_1 = local_290._0_2_;
    (iVar7._M_current)->_pos_x_1 = 0x13;
    (iVar7._M_current)->_pos_y_1 = 0x19;
    (iVar7._M_current)->_extra_byte_1 = 4;
    (iVar7._M_current)->field_0x5 = local_290[5];
    (iVar7._M_current)->_map_id_2 =
         (short)(CONCAT17(local_290[7],
                          CONCAT16(local_290[6],
                                   CONCAT15(local_290[5],
                                            CONCAT14(4,CONCAT13(0x19,CONCAT12(0x13,local_290._0_2_))
                                                    )))) >> 0x30);
    ppMVar1 = &(w->_map_connections).
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  local_290._0_2_ = 0x43;
  local_290[2] = '\0';
  local_290[3] = false;
  local_290[4] = false;
  local_290[5] = false;
  local_290[6] = false;
  local_290[7] = '\0';
  local_398[0] = uVar32;
  local_398[1] = uVar33;
  local_398[2] = uVar34;
  local_398[3] = uVar35;
  local_398._4_2_ = uVar36;
  local_398[6] = bVar56;
  local_398[7] = uVar37;
  pcVar43 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398
                      ,(size_type *)local_290,0);
  bVar40 = local_290[5];
  bVar39 = local_290[4];
  bVar56 = (bool)local_290[3];
  local_398[0] = (uint8_t)pcVar43;
  local_398[1] = (byte)((ulong)pcVar43 >> 8);
  local_398[2] = (byte)((ulong)pcVar43 >> 0x10);
  local_398[3] = (uint8_t)((ulong)pcVar43 >> 0x18);
  local_398._4_2_ = (undefined2)((ulong)pcVar43 >> 0x20);
  local_398[6] = SUB81((ulong)pcVar43 >> 0x30,0);
  local_398[7] = (uint8_t)((ulong)pcVar43 >> 0x38);
  uVar17 = CONCAT12(local_290[2],local_290._0_2_);
  uVar31 = CONCAT13(local_290[3],uVar17);
  lVar48 = CONCAT17(local_290[7],
                    CONCAT16(local_290[6],CONCAT15(local_290[5],CONCAT14(local_290[4],uVar31))));
  local_398[0x10] = (undefined1)local_290._0_2_;
  uVar38 = local_398[0x10];
  local_398[0x11] = SUB21(local_290._0_2_,1);
  local_398._18_2_ = (undefined2)((uint)uVar31 >> 0x10);
  local_398._20_4_ = (undefined4)((ulong)lVar48 >> 0x20);
  memcpy(pcVar43,"Goddess: I shall give you one,\nand only one word...\x1e\nThis word is \"",0x43);
  local_398._9_2_ = (undefined2)((uint3)uVar17 >> 8);
  local_398[0xb] = bVar56;
  local_398[0xc] = bVar39;
  local_398[0xd] = bVar40;
  local_398._14_2_ = (undefined2)((ulong)lVar48 >> 0x30);
  pcVar43[lVar48] = '\0';
  puVar53 = local_2e0 + 0x10;
  local_2e0[0] = SUB81(puVar53,0);
  local_2e0[1] = (uint8_t)((ulong)puVar53 >> 8);
  local_2e0[2] = (uint8_t)((ulong)puVar53 >> 0x10);
  local_2e0._3_4_ = (undefined4)((ulong)puVar53 >> 0x18);
  local_2e0[7] = (uint8_t)((ulong)puVar53 >> 0x38);
  local_2e0[0x10] = '\"';
  local_2e0[0x11] = '.';
  local_2e0._18_2_ = 3;
  local_2e0[8] = '\x03';
  local_2e0[9] = '\0';
  local_2e0[10] = false;
  local_2e0[0xb] = false;
  local_2e0[0xc] = false;
  local_2e0[0xd] = false;
  local_2e0[0xe] = false;
  local_2e0[0xf] = false;
  puVar53 = local_290 + 0x10;
  local_290._0_2_ = SUB82(puVar53,0);
  local_290[2] = (uint8_t)((ulong)puVar53 >> 0x10);
  local_290[3] = (byte)((ulong)puVar53 >> 0x18);
  local_290[4] = SUB81((ulong)puVar53 >> 0x20,0);
  local_290[5] = SUB81((ulong)puVar53 >> 0x28,0);
  local_290[6] = SUB81((ulong)puVar53 >> 0x30,0);
  local_290[7] = (uint8_t)((ulong)puVar53 >> 0x38);
  local_290[0x10] = 'O';
  local_290[0x11] = 'P';
  local_290._18_2_ = 0x4e45;
  local_290[8] = '\x04';
  local_290[9] = '\0';
  local_290[10] = false;
  local_290[0xb] = false;
  local_290[0xc] = false;
  local_290[0xd] = false;
  local_290[0xe] = false;
  local_290[0xf] = false;
  local_290._20_4_ = local_290._20_4_ & 0xffffff00;
  pEStack_270 = (pointer)auStack_260;
  local_268 = (pointer)0x4;
  auStack_260._0_5_ = 0x52554f59;
  local_250 = &local_240;
  local_240 = 0x53455945;
  local_248 = 4;
  local_23c = 0;
  local_230 = &local_220;
  local_220 = 0x41574f54;
  uStack_21c = 0x534452;
  local_228 = 7;
  local_219 = 0;
  local_210 = &local_200;
  local_200 = 0x5252494d;
  local_1fc = 0x524f;
  local_208 = 6;
  local_1fa = 0;
  local_1f0 = &local_1e0;
  local_1e0 = 0x49534e49;
  local_1dc = 0x4544;
  local_1e8 = 6;
  local_1da = 0;
  local_1d0 = &local_1c0;
  local_1c0 = 0x5353414d;
  uStack_1bc = 0x4e41;
  local_1c8 = 6;
  uStack_1ba = 0;
  plVar54 = &local_1a0;
  local_1a0._0_4_ = 0x45564143;
  local_1b0[1] = (long *)0x4;
  local_1a0._4_1_ = 0;
  __l._M_len = 8;
  __l._M_array = (iterator)local_290;
  local_398[8] = uVar38;
  local_1b0[0] = plVar54;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_120,__l,(allocator_type *)local_330);
  lVar48 = -0x100;
  do {
    if (plVar54 != (long *)plVar54[-2]) {
      operator_delete((long *)plVar54[-2],*plVar54 + 1);
    }
    plVar54 = plVar54 + -4;
    lVar48 = lVar48 + 0x20;
  } while (lVar48 != 0);
  local_188._0_8_ = (void *)0x0;
  local_188.palette = '\0';
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = false;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188._17_1_ = 0;
  local_188.behavior_id = 0;
  local_188._20_4_ = 0;
  local_330._0_2_ = 0x122;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_330);
  ppEVar46 = ((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppEVar46) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  pEVar42 = *ppEVar46;
  local_290._0_2_ = SUB82(pEVar42,0);
  local_290[2] = (uint8_t)((ulong)pEVar42 >> 0x10);
  local_290[3] = (byte)((ulong)pEVar42 >> 0x18);
  local_290[4] = SUB81((ulong)pEVar42 >> 0x20,0);
  local_290[5] = SUB81((ulong)pEVar42 >> 0x28,0);
  local_290[6] = SUB81((ulong)pEVar42 >> 0x30,0);
  local_290[7] = (uint8_t)((ulong)pEVar42 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&local_188,(Entity **)local_290);
  local_330._0_2_ = 0x1e6;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_330);
  ppEVar46 = ((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppEVar46) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  pEVar42 = *ppEVar46;
  local_290._0_2_ = SUB82(pEVar42,0);
  local_290[2] = (uint8_t)((ulong)pEVar42 >> 0x10);
  local_290[3] = (byte)((ulong)pEVar42 >> 0x18);
  local_290[4] = SUB81((ulong)pEVar42 >> 0x20,0);
  local_290[5] = SUB81((ulong)pEVar42 >> 0x28,0);
  local_290[6] = SUB81((ulong)pEVar42 >> 0x30,0);
  local_290[7] = (uint8_t)((ulong)pEVar42 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&local_188,(Entity **)local_290);
  local_330._0_2_ = 0x240;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_330);
  ppEVar46 = ((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar46 >> 3) < 3) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
  }
  pEVar42 = ppEVar46[2];
  local_290._0_2_ = SUB82(pEVar42,0);
  local_290[2] = (uint8_t)((ulong)pEVar42 >> 0x10);
  local_290[3] = (byte)((ulong)pEVar42 >> 0x18);
  local_290[4] = SUB81((ulong)pEVar42 >> 0x20,0);
  local_290[5] = SUB81((ulong)pEVar42 >> 0x28,0);
  local_290[6] = SUB81((ulong)pEVar42 >> 0x30,0);
  local_290[7] = (uint8_t)((ulong)pEVar42 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&local_188,(Entity **)local_290);
  local_330._0_2_ = 0xdc;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_330);
  ppEVar46 = ((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppEVar46) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  pEVar42 = *ppEVar46;
  local_290._0_2_ = SUB82(pEVar42,0);
  local_290[2] = (uint8_t)((ulong)pEVar42 >> 0x10);
  local_290[3] = (byte)((ulong)pEVar42 >> 0x18);
  local_290[4] = SUB81((ulong)pEVar42 >> 0x20,0);
  local_290[5] = SUB81((ulong)pEVar42 >> 0x28,0);
  local_290[6] = SUB81((ulong)pEVar42 >> 0x30,0);
  local_290[7] = (uint8_t)((ulong)pEVar42 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&local_188,(Entity **)local_290);
  local_330._0_2_ = 0x75;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_330);
  ppEVar46 = ((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar46 >> 3) < 4) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
  }
  pEVar42 = ppEVar46[3];
  local_290._0_2_ = SUB82(pEVar42,0);
  local_290[2] = (uint8_t)((ulong)pEVar42 >> 0x10);
  local_290[3] = (byte)((ulong)pEVar42 >> 0x18);
  local_290[4] = SUB81((ulong)pEVar42 >> 0x20,0);
  local_290[5] = SUB81((ulong)pEVar42 >> 0x28,0);
  local_290[6] = SUB81((ulong)pEVar42 >> 0x30,0);
  local_290[7] = (uint8_t)((ulong)pEVar42 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&local_188,(Entity **)local_290);
  local_330._0_2_ = 0x94;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_330);
  ppEVar46 = ((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar46 >> 3) < 2) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
  }
  pEVar42 = ppEVar46[1];
  local_290._0_2_ = SUB82(pEVar42,0);
  local_290[2] = (uint8_t)((ulong)pEVar42 >> 0x10);
  local_290[3] = (byte)((ulong)pEVar42 >> 0x18);
  local_290[4] = SUB81((ulong)pEVar42 >> 0x20,0);
  local_290[5] = SUB81((ulong)pEVar42 >> 0x28,0);
  local_290[6] = SUB81((ulong)pEVar42 >> 0x30,0);
  local_290[7] = (uint8_t)((ulong)pEVar42 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&local_188,(Entity **)local_290);
  local_330._0_2_ = 0x16f;
  ppMVar41 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(this_00,(key_type *)local_330);
  ppEVar46 = ((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (10 < (ulong)((long)((*ppMVar41)->_entities).
                         super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)ppEVar46 >> 3)) {
    pEVar42 = ppEVar46[10];
    local_290._0_2_ = SUB82(pEVar42,0);
    local_290[2] = (uint8_t)((ulong)pEVar42 >> 0x10);
    local_290[3] = (byte)((ulong)pEVar42 >> 0x18);
    local_290[4] = SUB81((ulong)pEVar42 >> 0x20,0);
    local_290[5] = SUB81((ulong)pEVar42 >> 0x28,0);
    local_290[6] = SUB81((ulong)pEVar42 >> 0x30,0);
    local_290[7] = (uint8_t)((ulong)pEVar42 >> 0x38);
    std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
              ((vector<Entity*,std::allocator<Entity*>> *)&local_188,(Entity **)local_290);
    local_330._0_2_ = 0x20a;
    ppMVar41 = std::
               map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
               ::at(this_00,(key_type *)local_330);
    ppEVar46 = ((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (((*ppMVar41)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppEVar46) {
      pEVar42 = *ppEVar46;
      local_290._0_2_ = SUB82(pEVar42,0);
      local_290[2] = (uint8_t)((ulong)pEVar42 >> 0x10);
      local_290[3] = (byte)((ulong)pEVar42 >> 0x18);
      local_290[4] = SUB81((ulong)pEVar42 >> 0x20,0);
      local_290[5] = SUB81((ulong)pEVar42 >> 0x28,0);
      local_290[6] = SUB81((ulong)pEVar42 >> 0x30,0);
      local_290[7] = (uint8_t)((ulong)pEVar42 >> 0x38);
      std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
                ((vector<Entity*,std::allocator<Entity*>> *)&local_188,(Entity **)local_290);
      if ((void *)CONCAT71(local_188._9_7_,local_188.palette) != (void *)local_188._0_8_) {
        lVar48 = 0;
        uVar51 = 0;
        do {
          pEVar42 = *(Entity **)(local_188._0_8_ + uVar51 * 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_330,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_398,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_120._0_8_ + lVar48));
          pbVar47 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_330,
                                (char *)CONCAT17(local_2e0[7],
                                                 CONCAT43(local_2e0._3_4_,
                                                          CONCAT12(local_2e0[2],
                                                                   CONCAT11(local_2e0[1],
                                                                            local_2e0[0])))),
                                CONCAT44(local_2e0._12_4_,local_2e0._8_4_));
          puVar53 = local_290 + 0x10;
          local_290._0_2_ = SUB82(puVar53,0);
          local_290[2] = (uint8_t)((ulong)puVar53 >> 0x10);
          local_290[3] = (byte)((ulong)puVar53 >> 0x18);
          local_290[4] = SUB81((ulong)puVar53 >> 0x20,0);
          local_290[5] = SUB81((ulong)puVar53 >> 0x28,0);
          local_290[6] = SUB81((ulong)puVar53 >> 0x30,0);
          local_290[7] = (uint8_t)((ulong)puVar53 >> 0x38);
          pcVar43 = (pbVar47->_M_dataplus)._M_p;
          paVar49 = &pbVar47->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar43 == paVar49) {
            sVar10 = paVar49->_M_allocated_capacity;
            local_290._24_8_ = *(undefined8 *)((long)&pbVar47->field_2 + 8);
            local_290[0x10] = (undefined1)sVar10;
            local_290[0x11] = (undefined1)(sVar10 >> 8);
            local_290._18_2_ = (undefined2)(sVar10 >> 0x10);
            local_290._20_4_ = (undefined4)(sVar10 >> 0x20);
          }
          else {
            local_290._0_2_ = SUB82(pcVar43,0);
            local_290[2] = (uint8_t)((ulong)pcVar43 >> 0x10);
            local_290[3] = (byte)((ulong)pcVar43 >> 0x18);
            local_290[4] = SUB81((ulong)pcVar43 >> 0x20,0);
            local_290[5] = SUB81((ulong)pcVar43 >> 0x28,0);
            local_290[6] = SUB81((ulong)pcVar43 >> 0x30,0);
            local_290[7] = (uint8_t)((ulong)pcVar43 >> 0x38);
            sVar10 = paVar49->_M_allocated_capacity;
            local_290[0x10] = (undefined1)sVar10;
            local_290[0x11] = (undefined1)(sVar10 >> 8);
            local_290._18_2_ = (undefined2)(sVar10 >> 0x10);
            local_290._20_4_ = (undefined4)(sVar10 >> 0x20);
          }
          sVar10 = pbVar47->_M_string_length;
          local_290[8] = (uint8_t)sVar10;
          local_290[9] = (uint8_t)(sVar10 >> 8);
          local_290[10] = SUB81(sVar10 >> 0x10,0);
          local_290[0xb] = SUB81(sVar10 >> 0x18,0);
          local_290[0xc] = SUB81(sVar10 >> 0x20,0);
          local_290[0xd] = SUB81(sVar10 >> 0x28,0);
          local_290[0xe] = SUB81(sVar10 >> 0x30,0);
          local_290[0xf] = SUB81(sVar10 >> 0x38,0);
          (pbVar47->_M_dataplus)._M_p = (pointer)paVar49;
          pbVar47->_M_string_length = 0;
          (pbVar47->field_2)._M_local_buf[0] = '\0';
          RandomizerWorld::add_custom_dialogue_raw((RandomizerWorld *)w,pEVar42,(string *)local_290)
          ;
          puVar53 = (undefined1 *)
                    CONCAT17(local_290[7],
                             CONCAT16(local_290[6],
                                      CONCAT15(local_290[5],
                                               CONCAT14(local_290[4],
                                                        CONCAT13(local_290[3],
                                                                 CONCAT12(local_290[2],
                                                                          local_290._0_2_))))));
          if (puVar53 != local_290 + 0x10) {
            operator_delete(puVar53,CONCAT44(local_290._20_4_,
                                             CONCAT22(local_290._18_2_,
                                                      CONCAT11(local_290[0x11],local_290[0x10]))) +
                                    1);
          }
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,
                            CONCAT44(local_330._20_4_,
                                     CONCAT22(local_330._18_2_,
                                              CONCAT11(local_330[0x11],local_330[0x10]))) + 1);
          }
          uVar51 = uVar51 + 1;
          lVar48 = lVar48 + 0x20;
        } while (uVar51 < (ulong)(CONCAT71(local_188._9_7_,local_188.palette) - local_188._0_8_ >> 3
                                 ));
      }
      local_290._0_2_ = 0x156;
      ppMVar41 = std::
                 map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
                 ::at(this_00,(key_type *)local_290);
      pMVar3 = *ppMVar41;
      pEVar42 = (Entity *)operator_new(0x58);
      local_290._0_2_ = 0x1951;
      local_290[2] = '\x18';
      local_290[3] = '\x03';
      local_290[4] = true;
      local_290[5] = false;
      local_290[6] = false;
      local_290[7] = '\0';
      local_290[8] = '\x01';
      local_290[0xd] = false;
      local_290[0xe] = false;
      local_290[9] = '\0';
      local_290[10] = false;
      local_290[0xb] = false;
      local_290[0xc] = false;
      local_290[0xf] = true;
      local_290[0x10] =
           (undefined1)
           ((uint)(*(int *)&(pMVar3->_speaker_ids).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                  *(int *)&(pMVar3->_speaker_ids).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 1);
      local_290._18_2_ = 0;
      local_290._24_8_ = (Entity *)0x0;
      pEStack_270 = (pointer)0x0;
      local_268 = (pointer)0x0;
      auStack_260._0_8_ = (pointer)0x0;
      auStack_260._8_8_ = &PTR_to_json_abi_cxx11__00261860;
      local_250 = (undefined4 *)CONCAT53(local_250._3_5_,0xff00ff);
      local_248 = local_248 & 0xffffffffff000000;
      Entity::Entity(pEVar42,(Attributes *)local_290);
      if (pEStack_270 != (pointer)0x0) {
        operator_delete(pEStack_270,auStack_260._0_8_ - (long)pEStack_270);
      }
      Map::add_entity(pMVar3,pEVar42);
      local_330._0_8_ = local_330 + 0x10;
      local_d0.type_id = 'B';
      local_d0.position.x = '\0';
      local_d0.position.y = '\0';
      local_d0.position.z = '\0';
      local_d0.position.half_x = false;
      local_d0.position.half_y = false;
      local_d0.position.half_z = false;
      local_d0.orientation = '\0';
      pcVar43 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_330,(size_type *)&local_d0,0);
      uVar11 = local_d0._0_8_;
      local_330[0x10] = local_d0.type_id;
      uVar38 = local_330[0x10];
      local_330[0x11] = local_d0.position.x;
      local_330._18_2_ = local_d0.position._1_2_;
      local_330._20_4_ = local_d0._4_4_;
      local_330._0_8_ = pcVar43;
      memcpy(pcVar43,"If only I could get closer to hear\nwhat the goddess has to say...\x03",0x42);
      local_330._9_7_ = SUB87(uVar11,1);
      pcVar43[uVar11] = '\0';
      local_330[8] = uVar38;
      RandomizerWorld::add_custom_dialogue_raw((RandomizerWorld *)w,pEVar42,(string *)local_330);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,
                        CONCAT44(local_330._20_4_,
                                 CONCAT22(local_330._18_2_,CONCAT11(local_330[0x11],local_330[0x10])
                                         )) + 1);
      }
      if ((void *)local_188._0_8_ != (void *)0x0) {
        operator_delete((void *)local_188._0_8_,
                        CONCAT44(local_188._20_4_,
                                 CONCAT22(local_188.behavior_id,
                                          CONCAT11(local_188._17_1_,local_188.dialogue))) -
                        local_188._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_120);
      puVar53 = (undefined1 *)
                CONCAT17(local_2e0[7],
                         CONCAT43(local_2e0._3_4_,
                                  CONCAT12(local_2e0[2],CONCAT11(local_2e0[1],local_2e0[0]))));
      if (puVar53 != local_2e0 + 0x10) {
        operator_delete(puVar53,CONCAT44(local_2e0._20_4_,
                                         CONCAT22(local_2e0._18_2_,
                                                  CONCAT11(local_2e0[0x11],local_2e0[0x10]))) + 1);
      }
      puVar53 = (undefined1 *)
                CONCAT17(local_398[7],
                         CONCAT16(local_398[6],
                                  CONCAT24(local_398._4_2_,
                                           CONCAT13(local_398[3],
                                                    CONCAT12(local_398[2],
                                                             CONCAT11(local_398[1],local_398[0])))))
                        );
      if (puVar53 != local_398 + 0x10) {
        operator_delete(puVar53,CONCAT44(local_398._20_4_,
                                         CONCAT22(local_398._18_2_,
                                                  CONCAT11(local_398[0x11],local_398[0x10]))) + 1);
      }
      return;
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",10);
}

Assistant:

void PatchSecretARG::alter_world(World& w)
{
    RandomizerWorld& world = reinterpret_cast<RandomizerWorld&>(w);

    add_foxy_in_knt(world);

    MapPalette* blue_palace_palette = build_blue_palace_palette(world);
    MapPalette* blue_shrine_palette = build_blue_shrine_palette(world);

    _room_1 = add_room_1(world, blue_palace_palette);

    _room_2 = add_room_2(world, blue_palace_palette);
    _room_1->fall_destination(_room_2->id());

    _room_3 = add_room_3(world, blue_palace_palette);
    world.map_connections().emplace_back(MapConnection(_room_2->id(), 18, 15, _room_3->id(), 40, 37));

    add_gnomes_in_mercator(world);

    _room_4 = add_room_4(world, blue_palace_palette);
    world.map_connections().emplace_back(MapConnection(_room_3->id(), 37, 26, _room_4->id(), 26, 19));

    _room_5 = add_room_5(world, blue_shrine_palette);
    world.map_connections().emplace_back(MapConnection(_room_4->id(), 21, 21, _room_5->id(), 25, 34, 2));

    _room_6 = add_room_6(world, blue_shrine_palette);
    world.map_connections().emplace_back(MapConnection(_room_5->id(), 19, 25, _room_6->id(), 34, 25, 4));

    add_statue_dialogues(world);
}